

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  undefined4 uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  code *pcVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  long lVar65;
  int iVar66;
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  int iVar73;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  long lVar74;
  uint uVar75;
  ulong uVar76;
  size_t sVar77;
  byte bVar78;
  ulong uVar79;
  float fVar80;
  float fVar81;
  float fVar131;
  float fVar132;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar86 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar87 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar88 [16];
  float fVar134;
  float fVar137;
  float fVar138;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined8 uVar156;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [16];
  float fVar159;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar169;
  float fVar178;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_600 [16];
  int local_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  size_t local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar205 [32];
  
  PVar11 = prim[1];
  uVar79 = (ulong)(byte)PVar11;
  lVar65 = uVar79 * 0x19;
  fVar159 = *(float *)(prim + lVar65 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar86 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar160 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar168 = fVar159 * auVar160._0_4_;
  fVar139 = fVar159 * auVar86._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar82);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar85);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar84);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar83);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar6);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar79 + 6);
  auVar93 = vpmovsxbd_avx2(auVar7);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar76 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 + uVar79 + 6);
  auVar101 = vpmovsxbd_avx2(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar69 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar91 = vpmovsxbd_avx2(auVar10);
  auVar96 = vcvtdq2ps_avx(auVar91);
  auVar201._4_4_ = fVar139;
  auVar201._0_4_ = fVar139;
  auVar201._8_4_ = fVar139;
  auVar201._12_4_ = fVar139;
  auVar201._16_4_ = fVar139;
  auVar201._20_4_ = fVar139;
  auVar201._24_4_ = fVar139;
  auVar201._28_4_ = fVar139;
  auVar203._8_4_ = 1;
  auVar203._0_8_ = 0x100000001;
  auVar203._12_4_ = 1;
  auVar203._16_4_ = 1;
  auVar203._20_4_ = 1;
  auVar203._24_4_ = 1;
  auVar203._28_4_ = 1;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar210 = ZEXT3264(auVar89);
  auVar99 = ZEXT1632(CONCAT412(fVar159 * auVar86._12_4_,
                               CONCAT48(fVar159 * auVar86._8_4_,
                                        CONCAT44(fVar159 * auVar86._4_4_,fVar139))));
  auVar98 = vpermps_avx2(auVar203,auVar99);
  auVar90 = vpermps_avx512vl(auVar89,auVar99);
  fVar139 = auVar90._0_4_;
  fVar154 = auVar90._4_4_;
  auVar99._4_4_ = fVar154 * auVar104._4_4_;
  auVar99._0_4_ = fVar139 * auVar104._0_4_;
  fVar155 = auVar90._8_4_;
  auVar99._8_4_ = fVar155 * auVar104._8_4_;
  fVar169 = auVar90._12_4_;
  auVar99._12_4_ = fVar169 * auVar104._12_4_;
  fVar178 = auVar90._16_4_;
  auVar99._16_4_ = fVar178 * auVar104._16_4_;
  fVar80 = auVar90._20_4_;
  auVar99._20_4_ = fVar80 * auVar104._20_4_;
  fVar81 = auVar90._24_4_;
  auVar99._24_4_ = fVar81 * auVar104._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar154;
  auVar97._0_4_ = auVar93._0_4_ * fVar139;
  auVar97._8_4_ = auVar93._8_4_ * fVar155;
  auVar97._12_4_ = auVar93._12_4_ * fVar169;
  auVar97._16_4_ = auVar93._16_4_ * fVar178;
  auVar97._20_4_ = auVar93._20_4_ * fVar80;
  auVar97._24_4_ = auVar93._24_4_ * fVar81;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar96._4_4_ * fVar154;
  auVar91._0_4_ = auVar96._0_4_ * fVar139;
  auVar91._8_4_ = auVar96._8_4_ * fVar155;
  auVar91._12_4_ = auVar96._12_4_ * fVar169;
  auVar91._16_4_ = auVar96._16_4_ * fVar178;
  auVar91._20_4_ = auVar96._20_4_ * fVar80;
  auVar91._24_4_ = auVar96._24_4_ * fVar81;
  auVar91._28_4_ = auVar90._28_4_;
  auVar82 = vfmadd231ps_fma(auVar99,auVar98,auVar92);
  auVar85 = vfmadd231ps_fma(auVar97,auVar98,auVar95);
  auVar84 = vfmadd231ps_fma(auVar91,auVar101,auVar98);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar201,auVar94);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar201,auVar103);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,auVar201);
  auVar202._4_4_ = fVar168;
  auVar202._0_4_ = fVar168;
  auVar202._8_4_ = fVar168;
  auVar202._12_4_ = fVar168;
  auVar202._16_4_ = fVar168;
  auVar202._20_4_ = fVar168;
  auVar202._24_4_ = fVar168;
  auVar202._28_4_ = fVar168;
  auVar91 = ZEXT1632(CONCAT412(fVar159 * auVar160._12_4_,
                               CONCAT48(fVar159 * auVar160._8_4_,
                                        CONCAT44(fVar159 * auVar160._4_4_,fVar168))));
  auVar97 = vpermps_avx2(auVar203,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  fVar159 = auVar91._0_4_;
  fVar139 = auVar91._4_4_;
  auVar98._4_4_ = fVar139 * auVar104._4_4_;
  auVar98._0_4_ = fVar159 * auVar104._0_4_;
  fVar154 = auVar91._8_4_;
  auVar98._8_4_ = fVar154 * auVar104._8_4_;
  fVar155 = auVar91._12_4_;
  auVar98._12_4_ = fVar155 * auVar104._12_4_;
  fVar169 = auVar91._16_4_;
  auVar98._16_4_ = fVar169 * auVar104._16_4_;
  fVar178 = auVar91._20_4_;
  auVar98._20_4_ = fVar178 * auVar104._20_4_;
  fVar80 = auVar91._24_4_;
  auVar98._24_4_ = fVar80 * auVar104._24_4_;
  auVar98._28_4_ = 1;
  auVar89._4_4_ = auVar93._4_4_ * fVar139;
  auVar89._0_4_ = auVar93._0_4_ * fVar159;
  auVar89._8_4_ = auVar93._8_4_ * fVar154;
  auVar89._12_4_ = auVar93._12_4_ * fVar155;
  auVar89._16_4_ = auVar93._16_4_ * fVar169;
  auVar89._20_4_ = auVar93._20_4_ * fVar178;
  auVar89._24_4_ = auVar93._24_4_ * fVar80;
  auVar89._28_4_ = auVar104._28_4_;
  auVar93._4_4_ = auVar96._4_4_ * fVar139;
  auVar93._0_4_ = auVar96._0_4_ * fVar159;
  auVar93._8_4_ = auVar96._8_4_ * fVar154;
  auVar93._12_4_ = auVar96._12_4_ * fVar155;
  auVar93._16_4_ = auVar96._16_4_ * fVar169;
  auVar93._20_4_ = auVar96._20_4_ * fVar178;
  auVar93._24_4_ = auVar96._24_4_ * fVar80;
  auVar93._28_4_ = auVar91._28_4_;
  auVar83 = vfmadd231ps_fma(auVar98,auVar97,auVar92);
  auVar6 = vfmadd231ps_fma(auVar89,auVar97,auVar95);
  auVar7 = vfmadd231ps_fma(auVar93,auVar97,auVar101);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar202,auVar94);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar202,auVar103);
  auVar191._8_4_ = 0x7fffffff;
  auVar191._0_8_ = 0x7fffffff7fffffff;
  auVar191._12_4_ = 0x7fffffff;
  auVar191._16_4_ = 0x7fffffff;
  auVar191._20_4_ = 0x7fffffff;
  auVar191._24_4_ = 0x7fffffff;
  auVar191._28_4_ = 0x7fffffff;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar202,auVar102);
  auVar94 = vandps_avx(ZEXT1632(auVar82),auVar191);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar189._16_4_ = 0x219392ef;
  auVar189._20_4_ = 0x219392ef;
  auVar189._24_4_ = 0x219392ef;
  auVar189._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar90._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar82._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar82._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar82._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar82._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar85),auVar191);
  uVar76 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar100._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar85._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar85._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar85._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar85._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar84),auVar191);
  uVar76 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar16 = (bool)((byte)uVar76 & 1);
  auVar94._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._0_4_;
  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._4_4_;
  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._8_4_;
  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = 0x3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar190._16_4_ = 0x3f800000;
  auVar190._20_4_ = 0x3f800000;
  auVar190._24_4_ = 0x3f800000;
  auVar190._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar90,auVar92,auVar190);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar100);
  auVar85 = vfnmadd213ps_fma(auVar100,auVar92,auVar190);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar84 = vfnmadd213ps_fma(auVar94,auVar92,auVar190);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar92,auVar92);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar102._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar102._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar102._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar93 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar165._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar165._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar165._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar165._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar165._16_4_ = auVar94._16_4_ * 0.0;
  auVar165._20_4_ = auVar94._20_4_ * 0.0;
  auVar165._24_4_ = auVar94._24_4_ * 0.0;
  auVar165._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar11 * 0x10 + uVar79 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar6));
  auVar101._4_4_ = auVar85._4_4_ * auVar94._4_4_;
  auVar101._0_4_ = auVar85._0_4_ * auVar94._0_4_;
  auVar101._8_4_ = auVar85._8_4_ * auVar94._8_4_;
  auVar101._12_4_ = auVar85._12_4_ * auVar94._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * 0.0;
  auVar101._20_4_ = auVar94._20_4_ * 0.0;
  auVar101._24_4_ = auVar94._24_4_ * 0.0;
  auVar101._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar92);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar6));
  auVar157._0_4_ = auVar85._0_4_ * auVar94._0_4_;
  auVar157._4_4_ = auVar85._4_4_ * auVar94._4_4_;
  auVar157._8_4_ = auVar85._8_4_ * auVar94._8_4_;
  auVar157._12_4_ = auVar85._12_4_ * auVar94._12_4_;
  auVar157._16_4_ = auVar94._16_4_ * 0.0;
  auVar157._20_4_ = auVar94._20_4_ * 0.0;
  auVar157._24_4_ = auVar94._24_4_ * 0.0;
  auVar157._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 + uVar79 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar96._4_4_ = auVar94._4_4_ * auVar84._4_4_;
  auVar96._0_4_ = auVar94._0_4_ * auVar84._0_4_;
  auVar96._8_4_ = auVar94._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar94._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar94._16_4_ * 0.0;
  auVar96._20_4_ = auVar94._20_4_ * 0.0;
  auVar96._24_4_ = auVar94._24_4_ * 0.0;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar105._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar102,auVar165);
  auVar92 = vpminsd_avx2(auVar101,auVar157);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92 = vpminsd_avx2(auVar96,auVar105);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar104._4_4_ = uVar3;
  auVar104._0_4_ = uVar3;
  auVar104._8_4_ = uVar3;
  auVar104._12_4_ = uVar3;
  auVar104._16_4_ = uVar3;
  auVar104._20_4_ = uVar3;
  auVar104._24_4_ = uVar3;
  auVar104._28_4_ = uVar3;
  auVar92 = vmaxps_avx512vl(auVar92,auVar104);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar92);
  auVar94 = vpmaxsd_avx2(auVar102,auVar165);
  auVar92 = vpmaxsd_avx2(auVar101,auVar157);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar92 = vpmaxsd_avx2(auVar96,auVar105);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar3;
  auVar103._0_4_ = uVar3;
  auVar103._8_4_ = uVar3;
  auVar103._12_4_ = uVar3;
  auVar103._16_4_ = uVar3;
  auVar103._20_4_ = uVar3;
  auVar103._24_4_ = uVar3;
  auVar103._28_4_ = uVar3;
  auVar92 = vminps_avx512vl(auVar92,auVar103);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar95);
  uVar22 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar156 = vcmpps_avx512vl(local_80,auVar94,2);
  if ((byte)((byte)uVar156 & (byte)uVar22) != 0) {
    uVar76 = (ulong)(byte)((byte)uVar156 & (byte)uVar22);
    local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar211 = ZEXT1664(auVar82);
    auVar212 = ZEXT464(0x35000000);
    sVar77 = k;
    local_548 = k;
    do {
      lVar23 = 0;
      for (uVar69 = uVar76; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar76 = uVar76 - 1 & uVar76;
      uVar3 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar69 = (ulong)(uint)((int)lVar23 << 6);
      uVar75 = *(uint *)(prim + 2);
      pGVar13 = (context->scene->geometries).items[uVar75].ptr;
      local_5d0 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x16);
      if (uVar76 != 0) {
        uVar72 = uVar76 - 1 & uVar76;
        for (uVar79 = uVar76; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        }
        if (uVar72 != 0) {
          for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_5a0 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x26);
      local_5b0 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x36);
      _local_5c0 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x46);
      iVar73 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar77 * 4)),
                              ZEXT416(*(uint *)(ray + sVar77 * 4 + 0x10)),0x1c);
      auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + sVar77 * 4 + 0x20)),0x28);
      auVar84 = vsubps_avx(local_5d0,auVar82);
      uVar140 = auVar84._0_4_;
      auVar86._4_4_ = uVar140;
      auVar86._0_4_ = uVar140;
      auVar86._8_4_ = uVar140;
      auVar86._12_4_ = uVar140;
      auVar85 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar159 = pre->ray_space[k].vz.field_0.m128[0];
      fVar139 = pre->ray_space[k].vz.field_0.m128[1];
      fVar154 = pre->ray_space[k].vz.field_0.m128[2];
      fVar155 = pre->ray_space[k].vz.field_0.m128[3];
      auVar88._0_4_ = fVar159 * auVar84._0_4_;
      auVar88._4_4_ = fVar139 * auVar84._4_4_;
      auVar88._8_4_ = fVar154 * auVar84._8_4_;
      auVar88._12_4_ = fVar155 * auVar84._12_4_;
      auVar85 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar85);
      auVar6 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar86);
      auVar85 = vshufps_avx(local_5d0,local_5d0,0xff);
      auVar83 = vsubps_avx(local_5a0,auVar82);
      uVar140 = auVar83._0_4_;
      auVar170._4_4_ = uVar140;
      auVar170._0_4_ = uVar140;
      auVar170._8_4_ = uVar140;
      auVar170._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar194._0_4_ = fVar159 * auVar83._0_4_;
      auVar194._4_4_ = fVar139 * auVar83._4_4_;
      auVar194._8_4_ = fVar154 * auVar83._8_4_;
      auVar194._12_4_ = fVar155 * auVar83._12_4_;
      auVar84 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar84);
      auVar7 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar170);
      auVar83 = vsubps_avx512vl(local_5b0,auVar82);
      uVar140 = auVar83._0_4_;
      auVar87._4_4_ = uVar140;
      auVar87._0_4_ = uVar140;
      auVar87._8_4_ = uVar140;
      auVar87._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar197._0_4_ = fVar159 * auVar83._0_4_;
      auVar197._4_4_ = fVar139 * auVar83._4_4_;
      auVar197._8_4_ = fVar154 * auVar83._8_4_;
      auVar197._12_4_ = fVar155 * auVar83._12_4_;
      auVar84 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar84);
      auVar83 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar87);
      auVar84 = vsubps_avx512vl(_local_5c0,auVar82);
      uVar140 = auVar84._0_4_;
      auVar160._4_4_ = uVar140;
      auVar160._0_4_ = uVar140;
      auVar160._8_4_ = uVar140;
      auVar160._12_4_ = uVar140;
      auVar82 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar198._0_4_ = fVar159 * auVar84._0_4_;
      auVar198._4_4_ = fVar139 * auVar84._4_4_;
      auVar198._8_4_ = fVar154 * auVar84._8_4_;
      auVar198._12_4_ = fVar155 * auVar84._12_4_;
      auVar82 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar82);
      auVar84 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar160);
      lVar23 = (long)iVar73 * 0x44;
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar140 = auVar6._0_4_;
      local_2e0._4_4_ = uVar140;
      local_2e0._0_4_ = uVar140;
      local_2e0._8_4_ = uVar140;
      local_2e0._12_4_ = uVar140;
      local_2e0._16_4_ = uVar140;
      local_2e0._20_4_ = uVar140;
      local_2e0._24_4_ = uVar140;
      local_2e0._28_4_ = uVar140;
      auVar145._8_4_ = 1;
      auVar145._0_8_ = 0x100000001;
      auVar145._12_4_ = 1;
      auVar145._16_4_ = 1;
      auVar145._20_4_ = 1;
      auVar145._24_4_ = 1;
      auVar145._28_4_ = 1;
      local_300 = vpermps_avx2(auVar145,ZEXT1632(auVar6));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      local_320 = vbroadcastss_avx512vl(auVar7);
      local_340 = vpermps_avx512vl(auVar145,ZEXT1632(auVar7));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar83);
      local_380 = vpermps_avx512vl(auVar145,ZEXT1632(auVar83));
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0xd8c);
      fVar159 = auVar84._0_4_;
      local_3a0._4_4_ = fVar159;
      local_3a0._0_4_ = fVar159;
      fStack_398 = fVar159;
      fStack_394 = fVar159;
      fStack_390 = fVar159;
      fStack_38c = fVar159;
      fStack_388 = fVar159;
      register0x0000139c = fVar159;
      _local_3c0 = vpermps_avx512vl(auVar145,ZEXT1632(auVar84));
      auVar95 = vmulps_avx512vl(_local_3a0,auVar103);
      auVar93 = vmulps_avx512vl(_local_3c0,auVar103);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_360);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_320);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_340);
      auVar96 = vfmadd231ps_avx512vl(auVar95,auVar94,local_2e0);
      auVar188 = ZEXT3264(auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar93,auVar94,local_300);
      auVar183 = ZEXT3264(auVar97);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0xd8c);
      auVar91 = vmulps_avx512vl(_local_3a0,auVar101);
      auVar98 = vmulps_avx512vl(_local_3c0,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar102,local_360);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_380);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_340);
      auVar8 = vfmadd231ps_fma(auVar91,auVar95,local_2e0);
      auVar192 = ZEXT1664(auVar8);
      auVar9 = vfmadd231ps_fma(auVar98,auVar95,local_300);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar8),auVar96);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar9),auVar97);
      auVar99 = vmulps_avx512vl(auVar97,auVar91);
      auVar89 = vmulps_avx512vl(auVar96,auVar98);
      auVar99 = vsubps_avx512vl(auVar99,auVar89);
      auVar82 = vshufps_avx(local_5a0,local_5a0,0xff);
      uVar156 = auVar85._0_8_;
      local_a0._8_8_ = uVar156;
      local_a0._0_8_ = uVar156;
      local_a0._16_8_ = uVar156;
      local_a0._24_8_ = uVar156;
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(local_5b0,local_5b0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(_local_5c0,_local_5c0,0xff);
      uVar156 = auVar82._0_8_;
      local_100._8_8_ = uVar156;
      local_100._0_8_ = uVar156;
      local_100._16_8_ = uVar156;
      local_100._24_8_ = uVar156;
      auVar89 = vmulps_avx512vl(local_100,auVar103);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_e0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_a0);
      auVar90 = vmulps_avx512vl(local_100,auVar101);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar102,local_e0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_c0);
      auVar10 = vfmadd231ps_fma(auVar90,auVar95,local_a0);
      auVar90 = vmulps_avx512vl(auVar98,auVar98);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar91);
      auVar100 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar10));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar90 = vmulps_avx512vl(auVar100,auVar90);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar156 = vcmpps_avx512vl(auVar99,auVar90,2);
      auVar82 = vblendps_avx(auVar6,local_5d0,8);
      auVar160 = auVar211._0_16_;
      auVar85 = vandps_avx512vl(auVar82,auVar160);
      auVar82 = vblendps_avx(auVar7,local_5a0,8);
      auVar82 = vandps_avx512vl(auVar82,auVar160);
      auVar85 = vmaxps_avx(auVar85,auVar82);
      auVar82 = vblendps_avx(auVar83,local_5b0,8);
      auVar86 = vandps_avx512vl(auVar82,auVar160);
      auVar82 = vblendps_avx(auVar84,_local_5c0,8);
      auVar82 = vandps_avx512vl(auVar82,auVar160);
      auVar82 = vmaxps_avx(auVar86,auVar82);
      auVar82 = vmaxps_avx(auVar85,auVar82);
      auVar85 = vmovshdup_avx(auVar82);
      auVar85 = vmaxss_avx(auVar85,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar85);
      local_560 = vcvtsi2ss_avx512f(_local_5c0,iVar73);
      auVar200._0_4_ = local_560._0_4_;
      auVar200._4_4_ = auVar200._0_4_;
      auVar200._8_4_ = auVar200._0_4_;
      auVar200._12_4_ = auVar200._0_4_;
      auVar200._16_4_ = auVar200._0_4_;
      auVar200._20_4_ = auVar200._0_4_;
      auVar200._24_4_ = auVar200._0_4_;
      auVar200._28_4_ = auVar200._0_4_;
      uVar22 = vcmpps_avx512vl(auVar200,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar156 & (byte)uVar22;
      local_5e0 = vmulss_avx512f(auVar82,auVar212._0_16_);
      auVar90 = auVar210._0_32_;
      auVar99 = vpermps_avx512vl(auVar90,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar90,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar90,ZEXT1632(auVar83));
      local_1a0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar84));
      uVar70 = *(uint *)(ray + sVar77 * 4 + 0x30);
      local_4c0._0_16_ = ZEXT416(uVar70);
      if (bVar78 != 0) {
        auVar101 = vmulps_avx512vl(local_1a0,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar101);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar102);
        auVar93 = vfmadd213ps_avx512vl(auVar95,auVar99,auVar93);
        auVar103 = vmulps_avx512vl(local_1a0,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar103);
        auVar102 = vfmadd213ps_avx512vl(auVar92,local_160,auVar104);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar94,auVar99,auVar102);
        auVar195._0_4_ = fVar159 * auVar95._0_4_;
        auVar195._4_4_ = fVar159 * auVar95._4_4_;
        auVar195._8_4_ = fVar159 * auVar95._8_4_;
        auVar195._12_4_ = fVar159 * auVar95._12_4_;
        auVar195._16_4_ = fVar159 * auVar95._16_4_;
        auVar195._20_4_ = fVar159 * auVar95._20_4_;
        auVar195._24_4_ = fVar159 * auVar95._24_4_;
        auVar195._28_4_ = 0;
        auVar94 = vmulps_avx512vl(_local_3c0,auVar95);
        auVar95 = vmulps_avx512vl(local_1a0,auVar95);
        auVar101 = vfmadd231ps_avx512vl(auVar195,auVar103,local_360);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,local_380);
        auVar103 = vfmadd231ps_avx512vl(auVar95,local_180,auVar103);
        auVar95 = vfmadd231ps_avx512vl(auVar101,auVar104,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
        auVar82 = vfmadd231ps_fma(auVar95,auVar92,local_2e0);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar92,local_300);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar92);
        auVar31._4_4_ = fVar159 * auVar103._4_4_;
        auVar31._0_4_ = fVar159 * auVar103._0_4_;
        auVar31._8_4_ = fVar159 * auVar103._8_4_;
        auVar31._12_4_ = fVar159 * auVar103._12_4_;
        auVar31._16_4_ = fVar159 * auVar103._16_4_;
        auVar31._20_4_ = fVar159 * auVar103._20_4_;
        auVar31._24_4_ = fVar159 * auVar103._24_4_;
        auVar31._28_4_ = auVar92._28_4_;
        auVar92 = vmulps_avx512vl(_local_3c0,auVar103);
        auVar103 = vmulps_avx512vl(local_1a0,auVar103);
        auVar100 = vfmadd231ps_avx512vl(auVar31,auVar104,local_360);
        auVar105 = vfmadd231ps_avx512vl(auVar92,auVar104,local_380);
        auVar209 = ZEXT3264(auVar99);
        auVar104 = vfmadd231ps_avx512vl(auVar103,local_180,auVar104);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar103 = vfmadd231ps_avx512vl(auVar100,auVar92,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar105,auVar92,local_340);
        auVar92 = vfmadd231ps_avx512vl(auVar104,local_160,auVar92);
        auVar212 = ZEXT1664(auVar212._0_16_);
        auVar210 = ZEXT3264(auVar90);
        auVar211 = ZEXT1664(auVar160);
        auVar85 = vfmadd231ps_fma(auVar103,auVar94,local_2e0);
        auVar104 = vfmadd231ps_avx512vl(auVar100,auVar94,local_300);
        auVar103 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar94);
        auVar204._8_4_ = 0x7fffffff;
        auVar204._0_8_ = 0x7fffffff7fffffff;
        auVar204._12_4_ = 0x7fffffff;
        auVar204._16_4_ = 0x7fffffff;
        auVar204._20_4_ = 0x7fffffff;
        auVar204._24_4_ = 0x7fffffff;
        auVar204._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(ZEXT1632(auVar82),auVar204);
        auVar92 = vandps_avx(auVar95,auVar204);
        auVar92 = vmaxps_avx(auVar94,auVar92);
        auVar94 = vandps_avx(auVar101,auVar204);
        auVar94 = vmaxps_avx(auVar92,auVar94);
        auVar199._4_4_ = local_5e0._0_4_;
        auVar199._0_4_ = local_5e0._0_4_;
        auVar199._8_4_ = local_5e0._0_4_;
        auVar199._12_4_ = local_5e0._0_4_;
        auVar199._16_4_ = local_5e0._0_4_;
        auVar199._20_4_ = local_5e0._0_4_;
        auVar199._24_4_ = local_5e0._0_4_;
        auVar199._28_4_ = local_5e0._0_4_;
        uVar69 = vcmpps_avx512vl(auVar94,auVar199,1);
        bVar16 = (bool)((byte)uVar69 & 1);
        auVar106._0_4_ = (float)((uint)bVar16 * auVar91._0_4_ | (uint)!bVar16 * auVar82._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar82._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar82._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar82._12_4_);
        fVar139 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
        auVar106._16_4_ = fVar139;
        fVar159 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
        auVar106._20_4_ = fVar159;
        fVar154 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
        auVar106._24_4_ = fVar154;
        uVar71 = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
        auVar106._28_4_ = uVar71;
        bVar16 = (bool)((byte)uVar69 & 1);
        auVar107._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar95._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar95._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar95._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar95._12_4_);
        bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar95._16_4_);
        bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar95._20_4_);
        bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar95._24_4_);
        bVar16 = SUB81(uVar69 >> 7,0);
        auVar107._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar95._28_4_;
        auVar94 = vandps_avx(auVar204,ZEXT1632(auVar85));
        auVar92 = vandps_avx(auVar104,auVar204);
        auVar92 = vmaxps_avx(auVar94,auVar92);
        auVar94 = vandps_avx(auVar103,auVar204);
        auVar94 = vmaxps_avx(auVar92,auVar94);
        uVar69 = vcmpps_avx512vl(auVar94,auVar199,1);
        bVar16 = (bool)((byte)uVar69 & 1);
        auVar108._0_4_ = (float)((uint)bVar16 * auVar91._0_4_ | (uint)!bVar16 * auVar85._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar85._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar85._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar85._12_4_);
        fVar155 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
        auVar108._16_4_ = fVar155;
        fVar169 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
        auVar108._20_4_ = fVar169;
        fVar178 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
        auVar108._24_4_ = fVar178;
        auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
        bVar16 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar104._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar104._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar104._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar104._12_4_);
        bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar104._16_4_);
        bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar104._20_4_);
        bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar104._24_4_);
        bVar16 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar104._28_4_;
        auVar87 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar94 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar87));
        auVar82 = vfmadd231ps_fma(auVar94,auVar107,auVar107);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar80 = auVar94._0_4_;
        fVar81 = auVar94._4_4_;
        fVar168 = auVar94._8_4_;
        fVar131 = auVar94._12_4_;
        fVar132 = auVar94._16_4_;
        fVar133 = auVar94._20_4_;
        fVar135 = auVar94._24_4_;
        auVar32._4_4_ = fVar81 * fVar81 * fVar81 * auVar82._4_4_ * -0.5;
        auVar32._0_4_ = fVar80 * fVar80 * fVar80 * auVar82._0_4_ * -0.5;
        auVar32._8_4_ = fVar168 * fVar168 * fVar168 * auVar82._8_4_ * -0.5;
        auVar32._12_4_ = fVar131 * fVar131 * fVar131 * auVar82._12_4_ * -0.5;
        auVar32._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar32._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar32._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar32._28_4_ = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar104 = vfmadd231ps_avx512vl(auVar32,auVar92,auVar94);
        auVar33._4_4_ = auVar107._4_4_ * auVar104._4_4_;
        auVar33._0_4_ = auVar107._0_4_ * auVar104._0_4_;
        auVar33._8_4_ = auVar107._8_4_ * auVar104._8_4_;
        auVar33._12_4_ = auVar107._12_4_ * auVar104._12_4_;
        auVar33._16_4_ = auVar107._16_4_ * auVar104._16_4_;
        auVar33._20_4_ = auVar107._20_4_ * auVar104._20_4_;
        auVar33._24_4_ = auVar107._24_4_ * auVar104._24_4_;
        auVar33._28_4_ = auVar94._28_4_;
        auVar34._4_4_ = auVar104._4_4_ * -auVar106._4_4_;
        auVar34._0_4_ = auVar104._0_4_ * -auVar106._0_4_;
        auVar34._8_4_ = auVar104._8_4_ * -auVar106._8_4_;
        auVar34._12_4_ = auVar104._12_4_ * -auVar106._12_4_;
        auVar34._16_4_ = auVar104._16_4_ * -fVar139;
        auVar34._20_4_ = auVar104._20_4_ * -fVar159;
        auVar34._24_4_ = auVar104._24_4_ * -fVar154;
        auVar34._28_4_ = uVar71 ^ 0x80000000;
        auVar94 = vmulps_avx512vl(auVar104,ZEXT1632(auVar87));
        auVar91 = ZEXT1632(auVar87);
        auVar103 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar91);
        auVar82 = vfmadd231ps_fma(auVar103,auVar109,auVar109);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar159 = auVar103._0_4_;
        fVar139 = auVar103._4_4_;
        fVar154 = auVar103._8_4_;
        fVar80 = auVar103._12_4_;
        fVar81 = auVar103._16_4_;
        fVar168 = auVar103._20_4_;
        fVar131 = auVar103._24_4_;
        auVar35._4_4_ = fVar139 * fVar139 * fVar139 * auVar82._4_4_ * -0.5;
        auVar35._0_4_ = fVar159 * fVar159 * fVar159 * auVar82._0_4_ * -0.5;
        auVar35._8_4_ = fVar154 * fVar154 * fVar154 * auVar82._8_4_ * -0.5;
        auVar35._12_4_ = fVar80 * fVar80 * fVar80 * auVar82._12_4_ * -0.5;
        auVar35._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar35._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar35._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar35._28_4_ = 0;
        auVar92 = vfmadd231ps_avx512vl(auVar35,auVar92,auVar103);
        auVar36._4_4_ = auVar109._4_4_ * auVar92._4_4_;
        auVar36._0_4_ = auVar109._0_4_ * auVar92._0_4_;
        auVar36._8_4_ = auVar109._8_4_ * auVar92._8_4_;
        auVar36._12_4_ = auVar109._12_4_ * auVar92._12_4_;
        auVar36._16_4_ = auVar109._16_4_ * auVar92._16_4_;
        auVar36._20_4_ = auVar109._20_4_ * auVar92._20_4_;
        auVar36._24_4_ = auVar109._24_4_ * auVar92._24_4_;
        auVar36._28_4_ = auVar103._28_4_;
        auVar37._4_4_ = -auVar108._4_4_ * auVar92._4_4_;
        auVar37._0_4_ = -auVar108._0_4_ * auVar92._0_4_;
        auVar37._8_4_ = -auVar108._8_4_ * auVar92._8_4_;
        auVar37._12_4_ = -auVar108._12_4_ * auVar92._12_4_;
        auVar37._16_4_ = -fVar155 * auVar92._16_4_;
        auVar37._20_4_ = -fVar169 * auVar92._20_4_;
        auVar37._24_4_ = -fVar178 * auVar92._24_4_;
        auVar37._28_4_ = auVar104._28_4_;
        auVar92 = vmulps_avx512vl(auVar92,auVar91);
        auVar82 = vfmadd213ps_fma(auVar33,auVar89,auVar96);
        auVar85 = vfmadd213ps_fma(auVar34,auVar89,auVar97);
        auVar104 = vfmadd213ps_avx512vl(auVar94,auVar89,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar36,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar86 = vfnmadd213ps_fma(auVar33,auVar89,auVar96);
        auVar101 = ZEXT1632(auVar10);
        auVar84 = vfmadd213ps_fma(auVar37,auVar101,ZEXT1632(auVar9));
        auVar160 = vfnmadd213ps_fma(auVar34,auVar89,auVar97);
        auVar83 = vfmadd213ps_fma(auVar92,auVar101,auVar93);
        auVar95 = vfnmadd231ps_avx512vl(auVar102,auVar89,auVar94);
        auVar8 = vfnmadd213ps_fma(auVar36,auVar101,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar37,auVar101,ZEXT1632(auVar9));
        auVar170 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar10),auVar92);
        auVar92 = vsubps_avx512vl(auVar103,ZEXT1632(auVar86));
        auVar94 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar160));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar83),auVar95);
        auVar102 = vmulps_avx512vl(auVar94,auVar95);
        auVar6 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar160),auVar93);
        auVar38._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar38._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar38._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar38._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar38._16_4_ = auVar93._16_4_ * 0.0;
        auVar38._20_4_ = auVar93._20_4_ * 0.0;
        auVar38._24_4_ = auVar93._24_4_ * 0.0;
        auVar38._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar38,auVar95,auVar92);
        auVar39._4_4_ = auVar160._4_4_ * auVar92._4_4_;
        auVar39._0_4_ = auVar160._0_4_ * auVar92._0_4_;
        auVar39._8_4_ = auVar160._8_4_ * auVar92._8_4_;
        auVar39._12_4_ = auVar160._12_4_ * auVar92._12_4_;
        auVar39._16_4_ = auVar92._16_4_ * 0.0;
        auVar39._20_4_ = auVar92._20_4_ * 0.0;
        auVar39._24_4_ = auVar92._24_4_ * 0.0;
        auVar39._28_4_ = auVar92._28_4_;
        auVar7 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar86),auVar94);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar91,auVar93);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,ZEXT1632(auVar6));
        auVar98 = ZEXT1632(auVar87);
        uVar69 = vcmpps_avx512vl(auVar94,auVar98,2);
        bVar68 = (byte)uVar69;
        fVar80 = (float)((uint)(bVar68 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar8._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar168 = (float)((uint)bVar16 * auVar82._4_4_ | (uint)!bVar16 * auVar8._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar132 = (float)((uint)bVar16 * auVar82._8_4_ | (uint)!bVar16 * auVar8._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar135 = (float)((uint)bVar16 * auVar82._12_4_ | (uint)!bVar16 * auVar8._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar168,fVar80))));
        fVar81 = (float)((uint)(bVar68 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar9._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar131 = (float)((uint)bVar16 * auVar85._4_4_ | (uint)!bVar16 * auVar9._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar133 = (float)((uint)bVar16 * auVar85._8_4_ | (uint)!bVar16 * auVar9._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar136 = (float)((uint)bVar16 * auVar85._12_4_ | (uint)!bVar16 * auVar9._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar131,fVar81))));
        auVar110._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar104._0_4_ |
                    (uint)!(bool)(bVar68 & 1) * auVar170._0_4_);
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar170._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar170._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar170._12_4_);
        fVar159 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
        auVar110._16_4_ = fVar159;
        fVar139 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
        auVar110._20_4_ = fVar139;
        fVar154 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
        auVar110._24_4_ = fVar154;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
        auVar110._28_4_ = iVar1;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar103);
        auVar111._0_4_ =
             (uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar84));
        auVar112._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar85._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar85._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar85._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar85._12_4_);
        fVar155 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_);
        auVar112._16_4_ = fVar155;
        fVar169 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_);
        auVar112._20_4_ = fVar169;
        fVar178 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_);
        auVar112._24_4_ = fVar178;
        auVar112._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar83));
        auVar113._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar104._0_4_
                    );
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar104._4_4_);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar104._8_4_);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar104._12_4_);
        bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar16 * auVar92._16_4_ | (uint)!bVar16 * auVar104._16_4_);
        bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar16 * auVar92._20_4_ | (uint)!bVar16 * auVar104._20_4_);
        bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar16 * auVar92._24_4_ | (uint)!bVar16 * auVar104._24_4_);
        bVar16 = SUB81(uVar69 >> 7,0);
        auVar113._28_4_ = (uint)bVar16 * auVar92._28_4_ | (uint)!bVar16 * auVar104._28_4_;
        auVar114._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar103._0_4_;
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar16 * (int)auVar86._4_4_ | (uint)!bVar16 * auVar103._4_4_;
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar16 * (int)auVar86._8_4_ | (uint)!bVar16 * auVar103._8_4_;
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar16 * (int)auVar86._12_4_ | (uint)!bVar16 * auVar103._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar103._28_4_;
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._0_4_ =
             (uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar83._0_4_;
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar83._4_4_;
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar83._8_4_;
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar83._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar95._28_4_;
        auVar115._28_4_ = iVar2;
        auVar96 = vsubps_avx512vl(auVar114,auVar102);
        auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar160._12_4_ |
                                                (uint)!bVar19 * auVar84._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar160._8_4_ |
                                                         (uint)!bVar18 * auVar84._8_4_,
                                                         CONCAT44((uint)bVar16 * (int)auVar160._4_4_
                                                                  | (uint)!bVar16 * auVar84._4_4_,
                                                                  (uint)(bVar68 & 1) *
                                                                  (int)auVar160._0_4_ |
                                                                  (uint)!(bool)(bVar68 & 1) *
                                                                  auVar84._0_4_)))),auVar101);
        auVar188 = ZEXT3264(auVar92);
        auVar104 = vsubps_avx(auVar115,auVar110);
        auVar103 = vsubps_avx(auVar102,auVar111);
        auVar192 = ZEXT3264(auVar103);
        auVar95 = vsubps_avx(auVar101,auVar112);
        auVar93 = vsubps_avx(auVar110,auVar113);
        auVar40._4_4_ = auVar104._4_4_ * fVar168;
        auVar40._0_4_ = auVar104._0_4_ * fVar80;
        auVar40._8_4_ = auVar104._8_4_ * fVar132;
        auVar40._12_4_ = auVar104._12_4_ * fVar135;
        auVar40._16_4_ = auVar104._16_4_ * 0.0;
        auVar40._20_4_ = auVar104._20_4_ * 0.0;
        auVar40._24_4_ = auVar104._24_4_ * 0.0;
        auVar40._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar40,auVar110,auVar96);
        auVar41._4_4_ = fVar131 * auVar96._4_4_;
        auVar41._0_4_ = fVar81 * auVar96._0_4_;
        auVar41._8_4_ = fVar133 * auVar96._8_4_;
        auVar41._12_4_ = fVar136 * auVar96._12_4_;
        auVar41._16_4_ = auVar96._16_4_ * 0.0;
        auVar41._20_4_ = auVar96._20_4_ * 0.0;
        auVar41._24_4_ = auVar96._24_4_ * 0.0;
        auVar41._28_4_ = auVar94._28_4_;
        auVar85 = vfmsub231ps_fma(auVar41,auVar102,auVar92);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar98,ZEXT1632(auVar82));
        auVar179._0_4_ = auVar92._0_4_ * auVar110._0_4_;
        auVar179._4_4_ = auVar92._4_4_ * auVar110._4_4_;
        auVar179._8_4_ = auVar92._8_4_ * auVar110._8_4_;
        auVar179._12_4_ = auVar92._12_4_ * auVar110._12_4_;
        auVar179._16_4_ = auVar92._16_4_ * fVar159;
        auVar179._20_4_ = auVar92._20_4_ * fVar139;
        auVar179._24_4_ = auVar92._24_4_ * fVar154;
        auVar179._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar179,auVar101,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar82));
        auVar94 = vmulps_avx512vl(auVar93,auVar111);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar103,auVar113);
        auVar42._4_4_ = auVar95._4_4_ * auVar113._4_4_;
        auVar42._0_4_ = auVar95._0_4_ * auVar113._0_4_;
        auVar42._8_4_ = auVar95._8_4_ * auVar113._8_4_;
        auVar42._12_4_ = auVar95._12_4_ * auVar113._12_4_;
        auVar42._16_4_ = auVar95._16_4_ * auVar113._16_4_;
        auVar42._20_4_ = auVar95._20_4_ * auVar113._20_4_;
        auVar42._24_4_ = auVar95._24_4_ * auVar113._24_4_;
        auVar42._28_4_ = auVar113._28_4_;
        auVar82 = vfmsub231ps_fma(auVar42,auVar112,auVar93);
        auVar180._0_4_ = auVar112._0_4_ * auVar103._0_4_;
        auVar180._4_4_ = auVar112._4_4_ * auVar103._4_4_;
        auVar180._8_4_ = auVar112._8_4_ * auVar103._8_4_;
        auVar180._12_4_ = auVar112._12_4_ * auVar103._12_4_;
        auVar180._16_4_ = fVar155 * auVar103._16_4_;
        auVar180._20_4_ = fVar169 * auVar103._20_4_;
        auVar180._24_4_ = fVar178 * auVar103._24_4_;
        auVar180._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar180,auVar95,auVar111);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar98,auVar94);
        auVar91 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar82));
        auVar183 = ZEXT3264(auVar91);
        auVar94 = vmaxps_avx(auVar97,auVar91);
        uVar156 = vcmpps_avx512vl(auVar94,auVar98,2);
        bVar78 = bVar78 & (byte)uVar156;
        if (bVar78 != 0) {
          uVar140 = *(undefined4 *)(ray + sVar77 * 4 + 0x80);
          auVar205._4_4_ = uVar140;
          auVar205._0_4_ = uVar140;
          auVar205._8_4_ = uVar140;
          auVar205._12_4_ = uVar140;
          auVar205._16_4_ = uVar140;
          auVar205._20_4_ = uVar140;
          auVar205._24_4_ = uVar140;
          auVar205._28_4_ = uVar140;
          auVar208 = ZEXT3264(auVar205);
          auVar43._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar43._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar43._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar43._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar43._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar43._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar43._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar43._28_4_ = auVar94._28_4_;
          auVar83 = vfmsub231ps_fma(auVar43,auVar95,auVar104);
          auVar44._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar44._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar44._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar44._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar44._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar44._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar44._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar44._28_4_ = auVar104._28_4_;
          auVar84 = vfmsub231ps_fma(auVar44,auVar96,auVar93);
          auVar45._4_4_ = auVar95._4_4_ * auVar96._4_4_;
          auVar45._0_4_ = auVar95._0_4_ * auVar96._0_4_;
          auVar45._8_4_ = auVar95._8_4_ * auVar96._8_4_;
          auVar45._12_4_ = auVar95._12_4_ * auVar96._12_4_;
          auVar45._16_4_ = auVar95._16_4_ * auVar96._16_4_;
          auVar45._20_4_ = auVar95._20_4_ * auVar96._20_4_;
          auVar45._24_4_ = auVar95._24_4_ * auVar96._24_4_;
          auVar45._28_4_ = auVar95._28_4_;
          auVar6 = vfmsub231ps_fma(auVar45,auVar103,auVar92);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar6));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
          auVar192 = ZEXT3264(auVar94);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar92 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar85),auVar24);
          auVar82 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
          auVar188 = ZEXT1664(auVar82);
          auVar46._4_4_ = auVar6._4_4_ * auVar110._4_4_;
          auVar46._0_4_ = auVar6._0_4_ * auVar110._0_4_;
          auVar46._8_4_ = auVar6._8_4_ * auVar110._8_4_;
          auVar46._12_4_ = auVar6._12_4_ * auVar110._12_4_;
          auVar46._16_4_ = fVar159 * 0.0;
          auVar46._20_4_ = fVar139 * 0.0;
          auVar46._24_4_ = fVar154 * 0.0;
          auVar46._28_4_ = iVar1;
          auVar84 = vfmadd231ps_fma(auVar46,auVar101,ZEXT1632(auVar84));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,ZEXT1632(auVar83));
          fVar159 = auVar82._0_4_;
          fVar139 = auVar82._4_4_;
          fVar154 = auVar82._8_4_;
          fVar155 = auVar82._12_4_;
          local_500 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar155,
                                         CONCAT48(auVar84._8_4_ * fVar154,
                                                  CONCAT44(auVar84._4_4_ * fVar139,
                                                           auVar84._0_4_ * fVar159))));
          auVar193 = ZEXT3264(local_500);
          auVar146._4_4_ = uVar70;
          auVar146._0_4_ = uVar70;
          auVar146._8_4_ = uVar70;
          auVar146._12_4_ = uVar70;
          auVar146._16_4_ = uVar70;
          auVar146._20_4_ = uVar70;
          auVar146._24_4_ = uVar70;
          auVar146._28_4_ = uVar70;
          uVar156 = vcmpps_avx512vl(local_500,auVar205,2);
          uVar22 = vcmpps_avx512vl(auVar146,local_500,2);
          bVar78 = (byte)uVar156 & (byte)uVar22 & bVar78;
          if (bVar78 != 0) {
            uVar79 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar79 = bVar78 & uVar79;
            if ((char)uVar79 != '\0') {
              fVar169 = auVar97._0_4_ * fVar159;
              fVar178 = auVar97._4_4_ * fVar139;
              auVar47._4_4_ = fVar178;
              auVar47._0_4_ = fVar169;
              fVar80 = auVar97._8_4_ * fVar154;
              auVar47._8_4_ = fVar80;
              fVar81 = auVar97._12_4_ * fVar155;
              auVar47._12_4_ = fVar81;
              fVar168 = auVar97._16_4_ * 0.0;
              auVar47._16_4_ = fVar168;
              fVar131 = auVar97._20_4_ * 0.0;
              auVar47._20_4_ = fVar131;
              fVar132 = auVar97._24_4_ * 0.0;
              auVar47._24_4_ = fVar132;
              auVar47._28_4_ = auVar97._28_4_;
              auVar147._8_4_ = 0x3f800000;
              auVar147._0_8_ = 0x3f8000003f800000;
              auVar147._12_4_ = 0x3f800000;
              auVar147._16_4_ = 0x3f800000;
              auVar147._20_4_ = 0x3f800000;
              auVar147._24_4_ = 0x3f800000;
              auVar147._28_4_ = 0x3f800000;
              auVar94 = vsubps_avx(auVar147,auVar47);
              local_2c0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar169 |
                          (uint)!(bool)(bVar68 & 1) * auVar94._0_4_);
              bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar16 * (int)fVar178 | (uint)!bVar16 * auVar94._4_4_)
              ;
              bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar16 * (int)fVar80 | (uint)!bVar16 * auVar94._8_4_);
              bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar94._12_4_);
              bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar94._16_4_);
              bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar94._20_4_);
              bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar16 * (int)fVar132 | (uint)!bVar16 * auVar94._24_4_);
              bVar16 = SUB81(uVar69 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar94._28_4_);
              auVar94 = vsubps_avx(ZEXT1632(auVar10),auVar89);
              auVar82 = vfmadd213ps_fma(auVar94,local_2c0,auVar89);
              uVar140 = *(undefined4 *)((long)pre->ray_space + sVar77 * 4 + -0x10);
              auVar25._4_4_ = uVar140;
              auVar25._0_4_ = uVar140;
              auVar25._8_4_ = uVar140;
              auVar25._12_4_ = uVar140;
              auVar25._16_4_ = uVar140;
              auVar25._20_4_ = uVar140;
              auVar25._24_4_ = uVar140;
              auVar25._28_4_ = uVar140;
              auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                           CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                    CONCAT44(auVar82._4_4_ +
                                                                             auVar82._4_4_,
                                                                             auVar82._0_4_ +
                                                                             auVar82._0_4_)))),
                                        auVar25);
              uVar72 = vcmpps_avx512vl(local_500,auVar94,6);
              uVar79 = uVar79 & uVar72;
              bVar78 = (byte)uVar79;
              if (bVar78 != 0) {
                auVar166._0_4_ = auVar91._0_4_ * fVar159;
                auVar166._4_4_ = auVar91._4_4_ * fVar139;
                auVar166._8_4_ = auVar91._8_4_ * fVar154;
                auVar166._12_4_ = auVar91._12_4_ * fVar155;
                auVar166._16_4_ = auVar91._16_4_ * 0.0;
                auVar166._20_4_ = auVar91._20_4_ * 0.0;
                auVar166._24_4_ = auVar91._24_4_ * 0.0;
                auVar166._28_4_ = 0;
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                auVar175._16_4_ = 0x3f800000;
                auVar175._20_4_ = 0x3f800000;
                auVar175._24_4_ = 0x3f800000;
                auVar175._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar175,auVar166);
                auVar116._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar166._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
                bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar116._4_4_ = (uint)bVar16 * (int)auVar166._4_4_ | (uint)!bVar16 * auVar94._4_4_;
                bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar116._8_4_ = (uint)bVar16 * (int)auVar166._8_4_ | (uint)!bVar16 * auVar94._8_4_;
                bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar116._12_4_ =
                     (uint)bVar16 * (int)auVar166._12_4_ | (uint)!bVar16 * auVar94._12_4_;
                bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar116._16_4_ =
                     (uint)bVar16 * (int)auVar166._16_4_ | (uint)!bVar16 * auVar94._16_4_;
                bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar116._20_4_ =
                     (uint)bVar16 * (int)auVar166._20_4_ | (uint)!bVar16 * auVar94._20_4_;
                bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar116._24_4_ =
                     (uint)bVar16 * (int)auVar166._24_4_ | (uint)!bVar16 * auVar94._24_4_;
                auVar116._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar94._28_4_;
                auVar26._8_4_ = 0x40000000;
                auVar26._0_8_ = 0x4000000040000000;
                auVar26._12_4_ = 0x40000000;
                auVar26._16_4_ = 0x40000000;
                auVar26._20_4_ = 0x40000000;
                auVar26._24_4_ = 0x40000000;
                auVar26._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar116,auVar175,auVar26);
                local_280 = local_500;
                local_260 = 0;
                local_25c = iVar73;
                auVar192 = ZEXT1664(local_5d0);
                local_250 = local_5d0;
                local_240 = local_5a0._0_8_;
                uStack_238 = local_5a0._8_8_;
                local_230 = local_5b0._0_8_;
                uStack_228 = local_5b0._8_8_;
                local_220 = local_5c0;
                uStack_218 = uStack_5b8;
                if ((pGVar13->mask & *(uint *)(ray + sVar77 * 4 + 0x90)) != 0) {
                  local_4e0 = SUB84(pGVar13,0);
                  uStack_4dc = (undefined4)((ulong)pGVar13 >> 0x20);
                  fVar159 = 1.0 / auVar200._0_4_;
                  local_200[0] = fVar159 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar159 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar159 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar159 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar159 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar159 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar159 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_500;
                  auVar148._8_4_ = 0x7f800000;
                  auVar148._0_8_ = 0x7f8000007f800000;
                  auVar148._12_4_ = 0x7f800000;
                  auVar148._16_4_ = 0x7f800000;
                  auVar148._20_4_ = 0x7f800000;
                  auVar148._24_4_ = 0x7f800000;
                  auVar148._28_4_ = 0x7f800000;
                  auVar94 = vblendmps_avx512vl(auVar148,local_500);
                  auVar117._0_4_ =
                       (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                  auVar117._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                  auVar117._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
                  auVar117._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                  auVar117._16_4_ = (uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
                  auVar117._20_4_ = (uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
                  auVar117._24_4_ = (uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = SUB81(uVar79 >> 7,0);
                  auVar117._28_4_ = (uint)bVar16 * auVar94._28_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar94 = vshufps_avx(auVar117,auVar117,0xb1);
                  auVar94 = vminps_avx(auVar117,auVar94);
                  auVar92 = vshufpd_avx(auVar94,auVar94,5);
                  auVar94 = vminps_avx(auVar94,auVar92);
                  auVar92 = vpermpd_avx2(auVar94,0x4e);
                  auVar94 = vminps_avx(auVar94,auVar92);
                  uVar156 = vcmpps_avx512vl(auVar117,auVar94,0);
                  uVar70 = (uint)uVar79;
                  if (((byte)uVar156 & bVar78) != 0) {
                    uVar70 = (uint)((byte)uVar156 & bVar78);
                  }
                  uVar71 = 0;
                  for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                    uVar71 = uVar71 + 1;
                  }
                  uVar69 = (ulong)uVar71;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_530 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_520 = auVar99;
                    do {
                      local_420 = local_200[uVar69];
                      local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                      *(undefined4 *)(ray + sVar77 * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + uVar69 * 4);
                      local_590.context = context->user;
                      fVar139 = 1.0 - local_420;
                      fVar159 = fVar139 * fVar139 * -3.0;
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                ZEXT416((uint)(local_420 * fVar139)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar139)),
                                                ZEXT416((uint)(local_420 * local_420)),
                                                ZEXT416(0x40000000));
                      fVar139 = auVar82._0_4_ * 3.0;
                      fVar154 = auVar85._0_4_ * 3.0;
                      fVar155 = local_420 * local_420 * 3.0;
                      auVar187._0_4_ = fVar155 * (float)local_5c0._0_4_;
                      auVar187._4_4_ = fVar155 * (float)local_5c0._4_4_;
                      auVar187._8_4_ = fVar155 * (float)uStack_5b8;
                      auVar187._12_4_ = fVar155 * uStack_5b8._4_4_;
                      auVar188 = ZEXT1664(auVar187);
                      auVar143._4_4_ = fVar154;
                      auVar143._0_4_ = fVar154;
                      auVar143._8_4_ = fVar154;
                      auVar143._12_4_ = fVar154;
                      auVar82 = vfmadd132ps_fma(auVar143,auVar187,local_5b0);
                      auVar174._4_4_ = fVar139;
                      auVar174._0_4_ = fVar139;
                      auVar174._8_4_ = fVar139;
                      auVar174._12_4_ = fVar139;
                      auVar82 = vfmadd132ps_fma(auVar174,auVar82,local_5a0);
                      auVar144._4_4_ = fVar159;
                      auVar144._0_4_ = fVar159;
                      auVar144._8_4_ = fVar159;
                      auVar144._12_4_ = fVar159;
                      auVar82 = vfmadd213ps_fma(auVar144,auVar192._0_16_,auVar82);
                      local_450 = auVar82._0_4_;
                      local_440 = vshufps_avx(auVar82,auVar82,0x55);
                      auVar183 = ZEXT1664(local_440);
                      local_430 = vshufps_avx(auVar82,auVar82,0xaa);
                      iStack_44c = local_450;
                      iStack_448 = local_450;
                      iStack_444 = local_450;
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = local_540._0_8_;
                      uStack_3f8 = local_540._8_8_;
                      local_3f0 = local_530;
                      vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                      uStack_3dc = (local_590.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_590.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_600 = local_490;
                      local_590.valid = (int *)local_600;
                      local_590.geometryUserPtr = *(void **)(CONCAT44(uStack_4dc,local_4e0) + 0x18);
                      local_590.hit = (RTCHitN *)&local_450;
                      local_590.N = 4;
                      pcVar15 = *(code **)(CONCAT44(uStack_4dc,local_4e0) + 0x40);
                      local_480 = auVar208._0_32_;
                      local_590.ray = (RTCRayN *)ray;
                      if (pcVar15 != (code *)0x0) {
                        auVar183 = ZEXT1664(local_440);
                        auVar188 = ZEXT1664(auVar187);
                        (*pcVar15)(&local_590);
                        auVar193 = ZEXT3264(local_500);
                        auVar208 = ZEXT3264(local_480);
                        auVar209 = ZEXT3264(local_520);
                        auVar192 = ZEXT1664(local_5d0);
                        auVar212 = ZEXT464(0x35000000);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar211 = ZEXT1664(auVar82);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar210 = ZEXT3264(auVar94);
                        sVar77 = local_548;
                      }
                      uVar72 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar72 & 0xf) == 0) {
LAB_01c84acb:
                        *(int *)(ray + sVar77 * 4 + 0x80) = auVar208._0_4_;
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(CONCAT44(uStack_4dc,local_4e0) + 0x3e) & 0x40) != 0)))) {
                          auVar183 = ZEXT1664(auVar183._0_16_);
                          auVar188 = ZEXT1664(auVar188._0_16_);
                          (*p_Var14)(&local_590);
                          auVar193 = ZEXT3264(local_500);
                          auVar208 = ZEXT3264(local_480);
                          auVar209 = ZEXT3264(local_520);
                          auVar192 = ZEXT1664(local_5d0);
                          auVar212 = ZEXT464(0x35000000);
                          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar211 = ZEXT1664(auVar82);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar210 = ZEXT3264(auVar94);
                          sVar77 = local_548;
                        }
                        uVar72 = vptestmd_avx512vl(local_600,local_600);
                        uVar72 = uVar72 & 0xf;
                        bVar78 = (byte)uVar72;
                        if (bVar78 == 0) goto LAB_01c84acb;
                        iVar1 = *(int *)(local_590.hit + 4);
                        iVar2 = *(int *)(local_590.hit + 8);
                        iVar66 = *(int *)(local_590.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar18 = SUB81(uVar72 >> 3,0);
                        *(uint *)(local_590.ray + 0xc0) =
                             (uint)(bVar78 & 1) * *(int *)local_590.hit |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xc0);
                        *(uint *)(local_590.ray + 0xc4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xc4);
                        *(uint *)(local_590.ray + 200) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 200);
                        *(uint *)(local_590.ray + 0xcc) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_590.ray + 0xcc);
                        iVar1 = *(int *)(local_590.hit + 0x14);
                        iVar2 = *(int *)(local_590.hit + 0x18);
                        iVar66 = *(int *)(local_590.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar18 = SUB81(uVar72 >> 3,0);
                        *(uint *)(local_590.ray + 0xd0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x10) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xd0);
                        *(uint *)(local_590.ray + 0xd4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xd4);
                        *(uint *)(local_590.ray + 0xd8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd8);
                        *(uint *)(local_590.ray + 0xdc) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_590.ray + 0xdc);
                        iVar1 = *(int *)(local_590.hit + 0x24);
                        iVar2 = *(int *)(local_590.hit + 0x28);
                        iVar66 = *(int *)(local_590.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar18 = SUB81(uVar72 >> 3,0);
                        *(uint *)(local_590.ray + 0xe0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x20) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xe0);
                        *(uint *)(local_590.ray + 0xe4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xe4);
                        *(uint *)(local_590.ray + 0xe8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe8);
                        *(uint *)(local_590.ray + 0xec) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_590.ray + 0xec);
                        iVar1 = *(int *)(local_590.hit + 0x34);
                        iVar2 = *(int *)(local_590.hit + 0x38);
                        iVar66 = *(int *)(local_590.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar18 = SUB81(uVar72 >> 3,0);
                        *(uint *)(local_590.ray + 0xf0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x30) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xf0);
                        *(uint *)(local_590.ray + 0xf4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xf4);
                        *(uint *)(local_590.ray + 0xf8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf8);
                        *(uint *)(local_590.ray + 0xfc) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_590.ray + 0xfc);
                        iVar1 = *(int *)(local_590.hit + 0x44);
                        iVar2 = *(int *)(local_590.hit + 0x48);
                        iVar66 = *(int *)(local_590.hit + 0x4c);
                        bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar18 = SUB81(uVar72 >> 3,0);
                        *(uint *)(local_590.ray + 0x100) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x40) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0x100);
                        *(uint *)(local_590.ray + 0x104) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0x104);
                        *(uint *)(local_590.ray + 0x108) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0x108);
                        *(uint *)(local_590.ray + 0x10c) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_590.ray + 0x10c)
                        ;
                        auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                        *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar82;
                        auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                        *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar82;
                        auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                        *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar82;
                        auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                        *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar82;
                        auVar208 = ZEXT464(*(uint *)(ray + sVar77 * 4 + 0x80));
                      }
                      auVar99 = auVar209._0_32_;
                      bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar79;
                      uVar140 = auVar208._0_4_;
                      auVar152._4_4_ = uVar140;
                      auVar152._0_4_ = uVar140;
                      auVar152._8_4_ = uVar140;
                      auVar152._12_4_ = uVar140;
                      auVar152._16_4_ = uVar140;
                      auVar152._20_4_ = uVar140;
                      auVar152._24_4_ = uVar140;
                      auVar152._28_4_ = uVar140;
                      uVar156 = vcmpps_avx512vl(auVar193._0_32_,auVar152,2);
                      if ((bVar78 & (byte)uVar156) == 0) goto LAB_01c839e0;
                      bVar78 = bVar78 & (byte)uVar156;
                      uVar79 = (ulong)bVar78;
                      auVar153._8_4_ = 0x7f800000;
                      auVar153._0_8_ = 0x7f8000007f800000;
                      auVar153._12_4_ = 0x7f800000;
                      auVar153._16_4_ = 0x7f800000;
                      auVar153._20_4_ = 0x7f800000;
                      auVar153._24_4_ = 0x7f800000;
                      auVar153._28_4_ = 0x7f800000;
                      auVar94 = vblendmps_avx512vl(auVar153,auVar193._0_32_);
                      auVar130._0_4_ =
                           (uint)(bVar78 & 1) * auVar94._0_4_ |
                           (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 1 & 1);
                      auVar130._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 2 & 1);
                      auVar130._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 3 & 1);
                      auVar130._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 4 & 1);
                      auVar130._16_4_ = (uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 5 & 1);
                      auVar130._20_4_ = (uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar78 >> 6 & 1);
                      auVar130._24_4_ = (uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * 0x7f800000;
                      auVar130._28_4_ =
                           (uint)(bVar78 >> 7) * auVar94._28_4_ |
                           (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                      auVar94 = vshufps_avx(auVar130,auVar130,0xb1);
                      auVar94 = vminps_avx(auVar130,auVar94);
                      auVar92 = vshufpd_avx(auVar94,auVar94,5);
                      auVar94 = vminps_avx(auVar94,auVar92);
                      auVar92 = vpermpd_avx2(auVar94,0x4e);
                      auVar94 = vminps_avx(auVar94,auVar92);
                      uVar156 = vcmpps_avx512vl(auVar130,auVar94,0);
                      bVar68 = (byte)uVar156 & bVar78;
                      if (bVar68 != 0) {
                        bVar78 = bVar68;
                      }
                      uVar70 = 0;
                      for (uVar71 = (uint)bVar78; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x80000000) {
                        uVar70 = uVar70 + 1;
                      }
                      uVar69 = (ulong)uVar70;
                    } while( true );
                  }
                  fVar159 = local_200[uVar69];
                  uVar140 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                  fVar154 = 1.0 - fVar159;
                  fVar139 = fVar154 * fVar154 * -3.0;
                  auVar183 = ZEXT464((uint)fVar139);
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                            ZEXT416((uint)(fVar159 * fVar154)),ZEXT416(0xc0000000));
                  auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar159 * fVar154)),
                                            ZEXT416((uint)(fVar159 * fVar159)),ZEXT416(0x40000000));
                  fVar154 = auVar82._0_4_ * 3.0;
                  fVar155 = auVar85._0_4_ * 3.0;
                  fVar169 = fVar159 * fVar159 * 3.0;
                  auVar184._0_4_ = fVar169 * (float)local_5c0._0_4_;
                  auVar184._4_4_ = fVar169 * (float)local_5c0._4_4_;
                  auVar184._8_4_ = fVar169 * (float)uStack_5b8;
                  auVar184._12_4_ = fVar169 * uStack_5b8._4_4_;
                  auVar188 = ZEXT1664(auVar184);
                  auVar161._4_4_ = fVar155;
                  auVar161._0_4_ = fVar155;
                  auVar161._8_4_ = fVar155;
                  auVar161._12_4_ = fVar155;
                  auVar82 = vfmadd132ps_fma(auVar161,auVar184,local_5b0);
                  auVar171._4_4_ = fVar154;
                  auVar171._0_4_ = fVar154;
                  auVar171._8_4_ = fVar154;
                  auVar171._12_4_ = fVar154;
                  auVar82 = vfmadd132ps_fma(auVar171,auVar82,local_5a0);
                  auVar162._4_4_ = fVar139;
                  auVar162._0_4_ = fVar139;
                  auVar162._8_4_ = fVar139;
                  auVar162._12_4_ = fVar139;
                  auVar82 = vfmadd213ps_fma(auVar162,local_5d0,auVar82);
                  *(undefined4 *)(ray + sVar77 * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar69 * 4)
                  ;
                  *(int *)(ray + sVar77 * 4 + 0xc0) = auVar82._0_4_;
                  uVar12 = vextractps_avx(auVar82,1);
                  *(undefined4 *)(ray + sVar77 * 4 + 0xd0) = uVar12;
                  uVar12 = vextractps_avx(auVar82,2);
                  *(undefined4 *)(ray + sVar77 * 4 + 0xe0) = uVar12;
                  *(float *)(ray + sVar77 * 4 + 0xf0) = fVar159;
                  *(undefined4 *)(ray + sVar77 * 4 + 0x100) = uVar140;
                  *(undefined4 *)(ray + sVar77 * 4 + 0x110) = uVar3;
                  *(uint *)(ray + sVar77 * 4 + 0x120) = uVar75;
                  *(uint *)(ray + sVar77 * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + sVar77 * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01c839e0:
      if (8 < iVar73) {
        auVar94 = vpbroadcastd_avx512vl();
        auVar209 = ZEXT3264(auVar94);
        local_4e0 = local_5e0._0_4_;
        uStack_4dc = local_5e0._0_4_;
        uStack_4d8 = local_5e0._0_4_;
        uStack_4d4 = local_5e0._0_4_;
        uStack_4d0 = local_5e0._0_4_;
        uStack_4cc = local_5e0._0_4_;
        uStack_4c8 = local_5e0._0_4_;
        uStack_4c4 = local_5e0._0_4_;
        local_480._4_4_ = local_4c0._0_4_;
        local_480._0_4_ = local_4c0._0_4_;
        local_480._8_4_ = local_4c0._0_4_;
        local_480._12_4_ = local_4c0._0_4_;
        local_480._16_4_ = local_4c0._0_4_;
        local_480._20_4_ = local_4c0._0_4_;
        local_480._24_4_ = local_4c0._0_4_;
        local_480._28_4_ = local_4c0._0_4_;
        local_120 = 1.0 / (float)local_560._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_530 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar74 = 8;
        local_520 = auVar99;
LAB_01c83a86:
        auVar94 = vpbroadcastd_avx512vl();
        auVar94 = vpor_avx2(auVar94,_DAT_01fe9900);
        uVar22 = vpcmpgtd_avx512vl(auVar209._0_32_,auVar94);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar74 * 4 + lVar23);
        auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21aa768 + lVar74 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar23 + 0x21aabec + lVar74 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar23 + 0x21ab070 + lVar74 * 4);
        auVar193._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar193._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar193._8_4_ = auVar103._8_4_ * fStack_398;
        auVar193._12_4_ = auVar103._12_4_ * fStack_394;
        auVar193._16_4_ = auVar103._16_4_ * fStack_390;
        auVar193._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar193._28_36_ = auVar188._28_36_;
        auVar193._24_4_ = auVar103._24_4_ * fStack_388;
        auVar188._0_4_ = auVar103._0_4_ * (float)local_3c0._0_4_;
        auVar188._4_4_ = auVar103._4_4_ * (float)local_3c0._4_4_;
        auVar188._8_4_ = auVar103._8_4_ * fStack_3b8;
        auVar188._12_4_ = auVar103._12_4_ * fStack_3b4;
        auVar188._16_4_ = auVar103._16_4_ * fStack_3b0;
        auVar188._20_4_ = auVar103._20_4_ * fStack_3ac;
        auVar188._28_36_ = auVar183._28_36_;
        auVar188._24_4_ = auVar103._24_4_ * fStack_3a8;
        auVar95 = vmulps_avx512vl(local_100,auVar103);
        auVar93 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar104,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar104,local_380);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_e0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_320);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar95,auVar92,local_c0);
        auVar82 = vfmadd231ps_fma(auVar93,auVar94,local_2e0);
        auVar188 = ZEXT1664(auVar82);
        auVar85 = vfmadd231ps_fma(auVar102,auVar94,local_300);
        auVar183 = ZEXT1664(auVar85);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar74 * 4 + lVar23);
        auVar93 = *(undefined1 (*) [32])(lVar23 + 0x21acb88 + lVar74 * 4);
        auVar91 = vfmadd231ps_avx512vl(auVar101,auVar94,local_a0);
        auVar102 = *(undefined1 (*) [32])(lVar23 + 0x21ad00c + lVar74 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar23 + 0x21ad490 + lVar74 * 4);
        auVar208._0_4_ = auVar101._0_4_ * (float)local_3a0._0_4_;
        auVar208._4_4_ = auVar101._4_4_ * (float)local_3a0._4_4_;
        auVar208._8_4_ = auVar101._8_4_ * fStack_398;
        auVar208._12_4_ = auVar101._12_4_ * fStack_394;
        auVar208._16_4_ = auVar101._16_4_ * fStack_390;
        auVar208._20_4_ = auVar101._20_4_ * fStack_38c;
        auVar208._28_36_ = auVar192._28_36_;
        auVar208._24_4_ = auVar101._24_4_ * fStack_388;
        auVar48._4_4_ = auVar101._4_4_ * (float)local_3c0._4_4_;
        auVar48._0_4_ = auVar101._0_4_ * (float)local_3c0._0_4_;
        auVar48._8_4_ = auVar101._8_4_ * fStack_3b8;
        auVar48._12_4_ = auVar101._12_4_ * fStack_3b4;
        auVar48._16_4_ = auVar101._16_4_ * fStack_3b0;
        auVar48._20_4_ = auVar101._20_4_ * fStack_3ac;
        auVar48._24_4_ = auVar101._24_4_ * fStack_3a8;
        auVar48._28_4_ = uStack_3a4;
        auVar96 = vmulps_avx512vl(local_100,auVar101);
        auVar97 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar102,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar48,auVar102,local_380);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_c0);
        auVar84 = vfmadd231ps_fma(auVar97,auVar95,local_2e0);
        auVar192 = ZEXT1664(auVar84);
        auVar83 = vfmadd231ps_fma(auVar98,auVar95,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar96,auVar95,local_a0);
        auVar99 = vmaxps_avx512vl(auVar91,auVar98);
        auVar96 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar82));
        auVar97 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
        auVar89 = vmulps_avx512vl(ZEXT1632(auVar85),auVar96);
        auVar90 = vmulps_avx512vl(ZEXT1632(auVar82),auVar97);
        auVar89 = vsubps_avx512vl(auVar89,auVar90);
        auVar90 = vmulps_avx512vl(auVar97,auVar97);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar96);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar90);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        uVar156 = vcmpps_avx512vl(auVar89,auVar99,2);
        bVar78 = (byte)uVar22 & (byte)uVar156;
        if (bVar78 != 0) {
          auVar101 = vmulps_avx512vl(local_1a0,auVar101);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar101);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar102);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_520,auVar93);
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar103);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar104);
          auVar93 = vfmadd213ps_avx512vl(auVar94,local_520,auVar92);
          auVar94 = *(undefined1 (*) [32])(lVar23 + 0x21ab4f4 + lVar74 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21ab978 + lVar74 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar23 + 0x21abdfc + lVar74 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar23 + 0x21ac280 + lVar74 * 4);
          auVar102 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar101 = vmulps_avx512vl(_local_3c0,auVar103);
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_360);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_380);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_180,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar102,auVar92,local_320);
          auVar102 = vfmadd231ps_avx512vl(auVar101,auVar92,local_340);
          auVar92 = vfmadd231ps_avx512vl(auVar104,local_160,auVar92);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_300);
          auVar6 = vfmadd231ps_fma(auVar92,auVar94,local_520);
          auVar94 = *(undefined1 (*) [32])(lVar23 + 0x21ad914 + lVar74 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21ae21c + lVar74 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar23 + 0x21ae6a0 + lVar74 * 4);
          auVar101 = vmulps_avx512vl(_local_3a0,auVar104);
          auVar99 = vmulps_avx512vl(_local_3c0,auVar104);
          auVar104 = vmulps_avx512vl(local_1a0,auVar104);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_380);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_180,auVar92);
          auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21add98 + lVar74 * 4);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_320);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_340);
          auVar92 = vfmadd231ps_avx512vl(auVar104,local_160,auVar92);
          auVar104 = vfmadd231ps_avx512vl(auVar101,auVar94,local_2e0);
          auVar101 = vfmadd231ps_avx512vl(auVar99,auVar94,local_300);
          auVar92 = vfmadd231ps_avx512vl(auVar92,local_520,auVar94);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar103,auVar99);
          vandps_avx512vl(auVar102,auVar99);
          auVar94 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(ZEXT1632(auVar6),auVar99);
          auVar94 = vmaxps_avx(auVar94,auVar99);
          auVar67._4_4_ = uStack_4dc;
          auVar67._0_4_ = local_4e0;
          auVar67._8_4_ = uStack_4d8;
          auVar67._12_4_ = uStack_4d4;
          auVar67._16_4_ = uStack_4d0;
          auVar67._20_4_ = uStack_4cc;
          auVar67._24_4_ = uStack_4c8;
          auVar67._28_4_ = uStack_4c4;
          uVar69 = vcmpps_avx512vl(auVar94,auVar67,1);
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar118._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar103._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar103._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar103._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar103._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar103._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar103._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar103._24_4_)
          ;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar118._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar119._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar102._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar102._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar102._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar102._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar102._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar102._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar102._24_4_)
          ;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar102._28_4_;
          vandps_avx512vl(auVar104,auVar99);
          vandps_avx512vl(auVar101,auVar99);
          auVar94 = vmaxps_avx(auVar119,auVar119);
          vandps_avx512vl(auVar92,auVar99);
          auVar94 = vmaxps_avx(auVar94,auVar119);
          uVar69 = vcmpps_avx512vl(auVar94,auVar67,1);
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar120._0_4_ = (uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar104._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar104._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar104._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar104._12_4_;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar120._16_4_ = (uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar104._16_4_;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar120._20_4_ = (uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar104._20_4_;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar120._24_4_ = (uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar104._24_4_;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar120._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar104._28_4_;
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar121._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar101._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar101._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar101._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar101._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar101._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar101._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar101._24_4_)
          ;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar121._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar101._28_4_;
          auVar196._8_4_ = 0x80000000;
          auVar196._0_8_ = 0x8000000080000000;
          auVar196._12_4_ = 0x80000000;
          auVar196._16_4_ = 0x80000000;
          auVar196._20_4_ = 0x80000000;
          auVar196._24_4_ = 0x80000000;
          auVar196._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar120,auVar196);
          auVar88 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar92 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar88));
          auVar6 = vfmadd231ps_fma(auVar92,auVar119,auVar119);
          auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar6));
          auVar206._8_4_ = 0xbf000000;
          auVar206._0_8_ = 0xbf000000bf000000;
          auVar206._12_4_ = 0xbf000000;
          auVar206._16_4_ = 0xbf000000;
          auVar206._20_4_ = 0xbf000000;
          auVar206._24_4_ = 0xbf000000;
          auVar206._28_4_ = 0xbf000000;
          fVar159 = auVar92._0_4_;
          fVar139 = auVar92._4_4_;
          fVar154 = auVar92._8_4_;
          fVar155 = auVar92._12_4_;
          fVar169 = auVar92._16_4_;
          fVar178 = auVar92._20_4_;
          fVar80 = auVar92._24_4_;
          auVar49._4_4_ = fVar139 * fVar139 * fVar139 * auVar6._4_4_ * -0.5;
          auVar49._0_4_ = fVar159 * fVar159 * fVar159 * auVar6._0_4_ * -0.5;
          auVar49._8_4_ = fVar154 * fVar154 * fVar154 * auVar6._8_4_ * -0.5;
          auVar49._12_4_ = fVar155 * fVar155 * fVar155 * auVar6._12_4_ * -0.5;
          auVar49._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar49._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar49._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
          auVar49._28_4_ = auVar119._28_4_;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar92 = vfmadd231ps_avx512vl(auVar49,auVar104,auVar92);
          auVar50._4_4_ = auVar119._4_4_ * auVar92._4_4_;
          auVar50._0_4_ = auVar119._0_4_ * auVar92._0_4_;
          auVar50._8_4_ = auVar119._8_4_ * auVar92._8_4_;
          auVar50._12_4_ = auVar119._12_4_ * auVar92._12_4_;
          auVar50._16_4_ = auVar119._16_4_ * auVar92._16_4_;
          auVar50._20_4_ = auVar119._20_4_ * auVar92._20_4_;
          auVar50._24_4_ = auVar119._24_4_ * auVar92._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar92._4_4_ * -auVar118._4_4_;
          auVar51._0_4_ = auVar92._0_4_ * -auVar118._0_4_;
          auVar51._8_4_ = auVar92._8_4_ * -auVar118._8_4_;
          auVar51._12_4_ = auVar92._12_4_ * -auVar118._12_4_;
          auVar51._16_4_ = auVar92._16_4_ * -auVar118._16_4_;
          auVar51._20_4_ = auVar92._20_4_ * -auVar118._20_4_;
          auVar51._24_4_ = auVar92._24_4_ * -auVar118._24_4_;
          auVar51._28_4_ = auVar119._28_4_;
          auVar103 = vmulps_avx512vl(auVar92,ZEXT1632(auVar88));
          auVar101 = ZEXT1632(auVar88);
          auVar92 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar101);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar121,auVar121);
          auVar102 = vrsqrt14ps_avx512vl(auVar92);
          auVar92 = vmulps_avx512vl(auVar92,auVar206);
          fVar159 = auVar102._0_4_;
          fVar139 = auVar102._4_4_;
          fVar154 = auVar102._8_4_;
          fVar155 = auVar102._12_4_;
          fVar169 = auVar102._16_4_;
          fVar178 = auVar102._20_4_;
          fVar80 = auVar102._24_4_;
          auVar52._4_4_ = fVar139 * fVar139 * fVar139 * auVar92._4_4_;
          auVar52._0_4_ = fVar159 * fVar159 * fVar159 * auVar92._0_4_;
          auVar52._8_4_ = fVar154 * fVar154 * fVar154 * auVar92._8_4_;
          auVar52._12_4_ = fVar155 * fVar155 * fVar155 * auVar92._12_4_;
          auVar52._16_4_ = fVar169 * fVar169 * fVar169 * auVar92._16_4_;
          auVar52._20_4_ = fVar178 * fVar178 * fVar178 * auVar92._20_4_;
          auVar52._24_4_ = fVar80 * fVar80 * fVar80 * auVar92._24_4_;
          auVar52._28_4_ = auVar92._28_4_;
          auVar92 = vfmadd231ps_avx512vl(auVar52,auVar104,auVar102);
          auVar53._4_4_ = auVar121._4_4_ * auVar92._4_4_;
          auVar53._0_4_ = auVar121._0_4_ * auVar92._0_4_;
          auVar53._8_4_ = auVar121._8_4_ * auVar92._8_4_;
          auVar53._12_4_ = auVar121._12_4_ * auVar92._12_4_;
          auVar53._16_4_ = auVar121._16_4_ * auVar92._16_4_;
          auVar53._20_4_ = auVar121._20_4_ * auVar92._20_4_;
          auVar53._24_4_ = auVar121._24_4_ * auVar92._24_4_;
          auVar53._28_4_ = auVar102._28_4_;
          auVar54._4_4_ = auVar92._4_4_ * auVar94._4_4_;
          auVar54._0_4_ = auVar92._0_4_ * auVar94._0_4_;
          auVar54._8_4_ = auVar92._8_4_ * auVar94._8_4_;
          auVar54._12_4_ = auVar92._12_4_ * auVar94._12_4_;
          auVar54._16_4_ = auVar92._16_4_ * auVar94._16_4_;
          auVar54._20_4_ = auVar92._20_4_ * auVar94._20_4_;
          auVar54._24_4_ = auVar92._24_4_ * auVar94._24_4_;
          auVar54._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar92,auVar101);
          auVar6 = vfmadd213ps_fma(auVar50,auVar91,ZEXT1632(auVar82));
          auVar7 = vfmadd213ps_fma(auVar51,auVar91,ZEXT1632(auVar85));
          auVar104 = vfmadd213ps_avx512vl(auVar103,auVar91,auVar93);
          auVar102 = vfmadd213ps_avx512vl(auVar53,auVar98,ZEXT1632(auVar84));
          auVar9 = vfnmadd213ps_fma(auVar50,auVar91,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar83));
          auVar10 = vfnmadd213ps_fma(auVar51,auVar91,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar94,auVar98,auVar95);
          auVar170 = vfnmadd231ps_fma(auVar93,auVar91,auVar103);
          auVar86 = vfnmadd213ps_fma(auVar53,auVar98,ZEXT1632(auVar84));
          auVar160 = vfnmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar83));
          auVar87 = vfnmadd231ps_fma(auVar95,auVar98,auVar94);
          auVar95 = vsubps_avx512vl(auVar102,ZEXT1632(auVar9));
          auVar94 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar10));
          auVar92 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar170));
          auVar55._4_4_ = auVar94._4_4_ * auVar170._4_4_;
          auVar55._0_4_ = auVar94._0_4_ * auVar170._0_4_;
          auVar55._8_4_ = auVar94._8_4_ * auVar170._8_4_;
          auVar55._12_4_ = auVar94._12_4_ * auVar170._12_4_;
          auVar55._16_4_ = auVar94._16_4_ * 0.0;
          auVar55._20_4_ = auVar94._20_4_ * 0.0;
          auVar55._24_4_ = auVar94._24_4_ * 0.0;
          auVar55._28_4_ = auVar103._28_4_;
          auVar84 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar10),auVar92);
          auVar56._4_4_ = auVar92._4_4_ * auVar9._4_4_;
          auVar56._0_4_ = auVar92._0_4_ * auVar9._0_4_;
          auVar56._8_4_ = auVar92._8_4_ * auVar9._8_4_;
          auVar56._12_4_ = auVar92._12_4_ * auVar9._12_4_;
          auVar56._16_4_ = auVar92._16_4_ * 0.0;
          auVar56._20_4_ = auVar92._20_4_ * 0.0;
          auVar56._24_4_ = auVar92._24_4_ * 0.0;
          auVar56._28_4_ = auVar92._28_4_;
          auVar83 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar170),auVar95);
          auVar57._4_4_ = auVar10._4_4_ * auVar95._4_4_;
          auVar57._0_4_ = auVar10._0_4_ * auVar95._0_4_;
          auVar57._8_4_ = auVar10._8_4_ * auVar95._8_4_;
          auVar57._12_4_ = auVar10._12_4_ * auVar95._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * 0.0;
          auVar57._20_4_ = auVar95._20_4_ * 0.0;
          auVar57._24_4_ = auVar95._24_4_ * 0.0;
          auVar57._28_4_ = auVar95._28_4_;
          auVar8 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar9),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar101,ZEXT1632(auVar83));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,ZEXT1632(auVar84));
          auVar89 = ZEXT1632(auVar88);
          uVar69 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar68 = (byte)uVar69;
          fVar131 = (float)((uint)(bVar68 & 1) * auVar6._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar86._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar133 = (float)((uint)bVar16 * auVar6._4_4_ | (uint)!bVar16 * auVar86._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar136 = (float)((uint)bVar16 * auVar6._8_4_ | (uint)!bVar16 * auVar86._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar137 = (float)((uint)bVar16 * auVar6._12_4_ | (uint)!bVar16 * auVar86._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar136,CONCAT44(fVar133,fVar131))));
          fVar132 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar160._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar135 = (float)((uint)bVar16 * auVar7._4_4_ | (uint)!bVar16 * auVar160._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar134 = (float)((uint)bVar16 * auVar7._8_4_ | (uint)!bVar16 * auVar160._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar138 = (float)((uint)bVar16 * auVar7._12_4_ | (uint)!bVar16 * auVar160._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar134,CONCAT44(fVar135,fVar132))));
          auVar122._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar87._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar87._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar87._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar87._12_4_)
          ;
          fVar154 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
          auVar122._16_4_ = fVar154;
          fVar139 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
          auVar122._20_4_ = fVar139;
          fVar159 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
          auVar122._24_4_ = fVar159;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
          auVar122._28_4_ = iVar1;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar102);
          auVar123._0_4_ =
               (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar84._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar84._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar84._12_4_;
          auVar123._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_;
          auVar123._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_;
          auVar123._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_;
          auVar123._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar82));
          auVar124._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_
                      );
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar6._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar6._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar6._12_4_);
          fVar178 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
          auVar124._16_4_ = fVar178;
          fVar169 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
          auVar124._20_4_ = fVar169;
          fVar155 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
          auVar124._24_4_ = fVar155;
          auVar124._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar170),ZEXT1632(auVar85));
          auVar125._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
                      );
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar7._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar7._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar7._12_4_);
          fVar80 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
          auVar125._16_4_ = fVar80;
          fVar81 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
          auVar125._20_4_ = fVar81;
          fVar168 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
          auVar125._24_4_ = fVar168;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar125._28_4_ = iVar2;
          auVar126._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar102._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar16 * (int)auVar9._4_4_ | (uint)!bVar16 * auVar102._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar16 * (int)auVar9._8_4_ | (uint)!bVar16 * auVar102._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar16 * (int)auVar9._12_4_ | (uint)!bVar16 * auVar102._12_4_;
          auVar126._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_;
          auVar126._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_;
          auVar126._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_;
          auVar126._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar102._28_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar102 = vsubps_avx512vl(auVar126,auVar101);
          auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar10._12_4_ |
                                                  (uint)!bVar20 * auVar82._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar10._8_4_ |
                                                           (uint)!bVar18 * auVar82._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar10._4_4_ |
                                                                    (uint)!bVar16 * auVar82._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar10._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar82._0_4_)))),auVar96);
          auVar188 = ZEXT3264(auVar92);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar170._12_4_ |
                                                   (uint)!bVar21 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar170._8_4_ |
                                                            (uint)!bVar19 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar170._4_4_ |
                                                                     (uint)!bVar17 * auVar85._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar170._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar85._0_4_)))),auVar122);
          auVar103 = vsubps_avx(auVar101,auVar123);
          auVar192 = ZEXT3264(auVar103);
          auVar95 = vsubps_avx(auVar96,auVar124);
          auVar93 = vsubps_avx(auVar122,auVar125);
          auVar58._4_4_ = auVar104._4_4_ * fVar133;
          auVar58._0_4_ = auVar104._0_4_ * fVar131;
          auVar58._8_4_ = auVar104._8_4_ * fVar136;
          auVar58._12_4_ = auVar104._12_4_ * fVar137;
          auVar58._16_4_ = auVar104._16_4_ * 0.0;
          auVar58._20_4_ = auVar104._20_4_ * 0.0;
          auVar58._24_4_ = auVar104._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar58,auVar122,auVar102);
          auVar176._0_4_ = fVar132 * auVar102._0_4_;
          auVar176._4_4_ = fVar135 * auVar102._4_4_;
          auVar176._8_4_ = fVar134 * auVar102._8_4_;
          auVar176._12_4_ = fVar138 * auVar102._12_4_;
          auVar176._16_4_ = auVar102._16_4_ * 0.0;
          auVar176._20_4_ = auVar102._20_4_ * 0.0;
          auVar176._24_4_ = auVar102._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar176,auVar101,auVar92);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar89,ZEXT1632(auVar82));
          auVar181._0_4_ = auVar92._0_4_ * auVar122._0_4_;
          auVar181._4_4_ = auVar92._4_4_ * auVar122._4_4_;
          auVar181._8_4_ = auVar92._8_4_ * auVar122._8_4_;
          auVar181._12_4_ = auVar92._12_4_ * auVar122._12_4_;
          auVar181._16_4_ = auVar92._16_4_ * fVar154;
          auVar181._20_4_ = auVar92._20_4_ * fVar139;
          auVar181._24_4_ = auVar92._24_4_ * fVar159;
          auVar181._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar181,auVar96,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar82));
          auVar94 = vmulps_avx512vl(auVar93,auVar123);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar103,auVar125);
          auVar59._4_4_ = auVar95._4_4_ * auVar125._4_4_;
          auVar59._0_4_ = auVar95._0_4_ * auVar125._0_4_;
          auVar59._8_4_ = auVar95._8_4_ * auVar125._8_4_;
          auVar59._12_4_ = auVar95._12_4_ * auVar125._12_4_;
          auVar59._16_4_ = auVar95._16_4_ * fVar80;
          auVar59._20_4_ = auVar95._20_4_ * fVar81;
          auVar59._24_4_ = auVar95._24_4_ * fVar168;
          auVar59._28_4_ = iVar2;
          auVar82 = vfmsub231ps_fma(auVar59,auVar124,auVar93);
          auVar182._0_4_ = auVar124._0_4_ * auVar103._0_4_;
          auVar182._4_4_ = auVar124._4_4_ * auVar103._4_4_;
          auVar182._8_4_ = auVar124._8_4_ * auVar103._8_4_;
          auVar182._12_4_ = auVar124._12_4_ * auVar103._12_4_;
          auVar182._16_4_ = fVar178 * auVar103._16_4_;
          auVar182._20_4_ = fVar169 * auVar103._20_4_;
          auVar182._24_4_ = fVar155 * auVar103._24_4_;
          auVar182._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar182,auVar95,auVar123);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar89,auVar94);
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar82));
          auVar183 = ZEXT3264(auVar99);
          auVar94 = vmaxps_avx(auVar97,auVar99);
          uVar156 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar78 = bVar78 & (byte)uVar156;
          if (bVar78 != 0) {
            uVar140 = *(undefined4 *)(ray + sVar77 * 4 + 0x80);
            auVar207._4_4_ = uVar140;
            auVar207._0_4_ = uVar140;
            auVar207._8_4_ = uVar140;
            auVar207._12_4_ = uVar140;
            auVar207._16_4_ = uVar140;
            auVar207._20_4_ = uVar140;
            auVar207._24_4_ = uVar140;
            auVar207._28_4_ = uVar140;
            auVar208 = ZEXT3264(auVar207);
            auVar60._4_4_ = auVar93._4_4_ * auVar92._4_4_;
            auVar60._0_4_ = auVar93._0_4_ * auVar92._0_4_;
            auVar60._8_4_ = auVar93._8_4_ * auVar92._8_4_;
            auVar60._12_4_ = auVar93._12_4_ * auVar92._12_4_;
            auVar60._16_4_ = auVar93._16_4_ * auVar92._16_4_;
            auVar60._20_4_ = auVar93._20_4_ * auVar92._20_4_;
            auVar60._24_4_ = auVar93._24_4_ * auVar92._24_4_;
            auVar60._28_4_ = auVar94._28_4_;
            auVar83 = vfmsub231ps_fma(auVar60,auVar95,auVar104);
            auVar61._4_4_ = auVar104._4_4_ * auVar103._4_4_;
            auVar61._0_4_ = auVar104._0_4_ * auVar103._0_4_;
            auVar61._8_4_ = auVar104._8_4_ * auVar103._8_4_;
            auVar61._12_4_ = auVar104._12_4_ * auVar103._12_4_;
            auVar61._16_4_ = auVar104._16_4_ * auVar103._16_4_;
            auVar61._20_4_ = auVar104._20_4_ * auVar103._20_4_;
            auVar61._24_4_ = auVar104._24_4_ * auVar103._24_4_;
            auVar61._28_4_ = auVar104._28_4_;
            auVar84 = vfmsub231ps_fma(auVar61,auVar102,auVar93);
            auVar62._4_4_ = auVar95._4_4_ * auVar102._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar102._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar102._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar102._12_4_;
            auVar62._16_4_ = auVar95._16_4_ * auVar102._16_4_;
            auVar62._20_4_ = auVar95._20_4_ * auVar102._20_4_;
            auVar62._24_4_ = auVar95._24_4_ * auVar102._24_4_;
            auVar62._28_4_ = auVar95._28_4_;
            auVar6 = vfmsub231ps_fma(auVar62,auVar103,auVar92);
            auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar6));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar83),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar192 = ZEXT3264(auVar94);
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar92 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar85),auVar28);
            auVar82 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
            auVar188 = ZEXT1664(auVar82);
            auVar63._4_4_ = auVar6._4_4_ * auVar122._4_4_;
            auVar63._0_4_ = auVar6._0_4_ * auVar122._0_4_;
            auVar63._8_4_ = auVar6._8_4_ * auVar122._8_4_;
            auVar63._12_4_ = auVar6._12_4_ * auVar122._12_4_;
            auVar63._16_4_ = fVar154 * 0.0;
            auVar63._20_4_ = fVar139 * 0.0;
            auVar63._24_4_ = fVar159 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar84 = vfmadd231ps_fma(auVar63,auVar96,ZEXT1632(auVar84));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar101,ZEXT1632(auVar83));
            fVar159 = auVar82._0_4_;
            fVar139 = auVar82._4_4_;
            fVar154 = auVar82._8_4_;
            fVar155 = auVar82._12_4_;
            local_500 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar155,
                                           CONCAT48(auVar84._8_4_ * fVar154,
                                                    CONCAT44(auVar84._4_4_ * fVar139,
                                                             auVar84._0_4_ * fVar159))));
            auVar193 = ZEXT3264(local_500);
            uVar156 = vcmpps_avx512vl(local_500,auVar207,2);
            uVar22 = vcmpps_avx512vl(local_500,local_480,0xd);
            bVar78 = (byte)uVar156 & (byte)uVar22 & bVar78;
            if (bVar78 != 0) {
              uVar79 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar79 = bVar78 & uVar79;
              if ((char)uVar79 != '\0') {
                fVar169 = auVar97._0_4_ * fVar159;
                fVar178 = auVar97._4_4_ * fVar139;
                auVar64._4_4_ = fVar178;
                auVar64._0_4_ = fVar169;
                fVar80 = auVar97._8_4_ * fVar154;
                auVar64._8_4_ = fVar80;
                fVar81 = auVar97._12_4_ * fVar155;
                auVar64._12_4_ = fVar81;
                fVar168 = auVar97._16_4_ * 0.0;
                auVar64._16_4_ = fVar168;
                fVar131 = auVar97._20_4_ * 0.0;
                auVar64._20_4_ = fVar131;
                fVar132 = auVar97._24_4_ * 0.0;
                auVar64._24_4_ = fVar132;
                auVar64._28_4_ = auVar97._28_4_;
                auVar167._8_4_ = 0x3f800000;
                auVar167._0_8_ = 0x3f8000003f800000;
                auVar167._12_4_ = 0x3f800000;
                auVar167._16_4_ = 0x3f800000;
                auVar167._20_4_ = 0x3f800000;
                auVar167._24_4_ = 0x3f800000;
                auVar167._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar167,auVar64);
                local_2c0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar169 |
                            (uint)!(bool)(bVar68 & 1) * auVar94._0_4_);
                bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar16 * (int)fVar178 | (uint)!bVar16 * auVar94._4_4_);
                bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar16 * (int)fVar80 | (uint)!bVar16 * auVar94._8_4_);
                bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar94._12_4_);
                bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar94._16_4_);
                bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar94._20_4_);
                bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar16 * (int)fVar132 | (uint)!bVar16 * auVar94._24_4_);
                bVar16 = SUB81(uVar69 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar94._28_4_);
                auVar94 = vsubps_avx(auVar98,auVar91);
                auVar82 = vfmadd213ps_fma(auVar94,local_2c0,auVar91);
                uVar140 = *(undefined4 *)((long)pre->ray_space + sVar77 * 4 + -0x10);
                auVar29._4_4_ = uVar140;
                auVar29._0_4_ = uVar140;
                auVar29._8_4_ = uVar140;
                auVar29._12_4_ = uVar140;
                auVar29._16_4_ = uVar140;
                auVar29._20_4_ = uVar140;
                auVar29._24_4_ = uVar140;
                auVar29._28_4_ = uVar140;
                auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                             CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                      CONCAT44(auVar82._4_4_ +
                                                                               auVar82._4_4_,
                                                                               auVar82._0_4_ +
                                                                               auVar82._0_4_)))),
                                          auVar29);
                uVar72 = vcmpps_avx512vl(local_500,auVar94,6);
                uVar79 = uVar79 & uVar72;
                bVar78 = (byte)uVar79;
                if (bVar78 != 0) {
                  auVar158._0_4_ = auVar99._0_4_ * fVar159;
                  auVar158._4_4_ = auVar99._4_4_ * fVar139;
                  auVar158._8_4_ = auVar99._8_4_ * fVar154;
                  auVar158._12_4_ = auVar99._12_4_ * fVar155;
                  auVar158._16_4_ = auVar99._16_4_ * 0.0;
                  auVar158._20_4_ = auVar99._20_4_ * 0.0;
                  auVar158._24_4_ = auVar99._24_4_ * 0.0;
                  auVar158._28_4_ = 0;
                  auVar177._8_4_ = 0x3f800000;
                  auVar177._0_8_ = 0x3f8000003f800000;
                  auVar177._12_4_ = 0x3f800000;
                  auVar177._16_4_ = 0x3f800000;
                  auVar177._20_4_ = 0x3f800000;
                  auVar177._24_4_ = 0x3f800000;
                  auVar177._28_4_ = 0x3f800000;
                  auVar94 = vsubps_avx(auVar177,auVar158);
                  auVar127._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar158._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar127._4_4_ =
                       (uint)bVar16 * (int)auVar158._4_4_ | (uint)!bVar16 * auVar94._4_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar127._8_4_ =
                       (uint)bVar16 * (int)auVar158._8_4_ | (uint)!bVar16 * auVar94._8_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar127._12_4_ =
                       (uint)bVar16 * (int)auVar158._12_4_ | (uint)!bVar16 * auVar94._12_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar127._16_4_ =
                       (uint)bVar16 * (int)auVar158._16_4_ | (uint)!bVar16 * auVar94._16_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar127._20_4_ =
                       (uint)bVar16 * (int)auVar158._20_4_ | (uint)!bVar16 * auVar94._20_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar127._24_4_ =
                       (uint)bVar16 * (int)auVar158._24_4_ | (uint)!bVar16 * auVar94._24_4_;
                  auVar127._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar94._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar127,auVar177,auVar30);
                  local_280 = local_500;
                  local_260 = (int)lVar74;
                  local_25c = iVar73;
                  auVar192 = ZEXT1664(local_5d0);
                  local_250 = local_5d0;
                  local_240 = local_5a0._0_8_;
                  uStack_238 = local_5a0._8_8_;
                  local_230 = local_5b0._0_8_;
                  uStack_228 = local_5b0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar13 = (context->scene->geometries).items[uVar75].ptr;
                  local_5e0._0_8_ = pGVar13;
                  if ((pGVar13->mask & *(uint *)(ray + sVar77 * 4 + 0x90)) != 0) {
                    auVar82 = vcvtsi2ss_avx512f(auVar88,(int)lVar74);
                    fVar159 = auVar82._0_4_;
                    local_200[0] = (fVar159 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar159 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar159 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar159 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar159 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar159 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar159 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar159 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_500;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar94 = vblendmps_avx512vl(auVar149,local_500);
                    auVar128._0_4_ =
                         (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000
                    ;
                    bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                    auVar128._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                    auVar128._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
                    auVar128._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                    auVar128._16_4_ = (uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
                    auVar128._20_4_ = (uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
                    auVar128._24_4_ = (uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = SUB81(uVar79 >> 7,0);
                    auVar128._28_4_ = (uint)bVar16 * auVar94._28_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar94 = vminps_avx(auVar128,auVar94);
                    auVar92 = vshufpd_avx(auVar94,auVar94,5);
                    auVar94 = vminps_avx(auVar94,auVar92);
                    auVar92 = vpermpd_avx2(auVar94,0x4e);
                    auVar94 = vminps_avx(auVar94,auVar92);
                    uVar156 = vcmpps_avx512vl(auVar128,auVar94,0);
                    uVar70 = (uint)uVar79;
                    if (((byte)uVar156 & bVar78) != 0) {
                      uVar70 = (uint)((byte)uVar156 & bVar78);
                    }
                    uVar71 = 0;
                    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar69 = (ulong)uVar71;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar209._0_32_);
                      local_5e4 = iVar73;
                      do {
                        local_420 = local_200[uVar69];
                        local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                        *(undefined4 *)(ray + sVar77 * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar69 * 4);
                        local_590.context = context->user;
                        fVar139 = 1.0 - local_420;
                        fVar159 = fVar139 * fVar139 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                  ZEXT416((uint)(local_420 * fVar139)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar139)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar139 = auVar82._0_4_ * 3.0;
                        fVar154 = auVar85._0_4_ * 3.0;
                        fVar155 = local_420 * local_420 * 3.0;
                        auVar186._0_4_ = fVar155 * (float)local_5c0._0_4_;
                        auVar186._4_4_ = fVar155 * (float)local_5c0._4_4_;
                        auVar186._8_4_ = fVar155 * (float)uStack_5b8;
                        auVar186._12_4_ = fVar155 * uStack_5b8._4_4_;
                        auVar188 = ZEXT1664(auVar186);
                        auVar141._4_4_ = fVar154;
                        auVar141._0_4_ = fVar154;
                        auVar141._8_4_ = fVar154;
                        auVar141._12_4_ = fVar154;
                        auVar82 = vfmadd132ps_fma(auVar141,auVar186,local_5b0);
                        auVar173._4_4_ = fVar139;
                        auVar173._0_4_ = fVar139;
                        auVar173._8_4_ = fVar139;
                        auVar173._12_4_ = fVar139;
                        auVar82 = vfmadd132ps_fma(auVar173,auVar82,local_5a0);
                        auVar142._4_4_ = fVar159;
                        auVar142._0_4_ = fVar159;
                        auVar142._8_4_ = fVar159;
                        auVar142._12_4_ = fVar159;
                        auVar82 = vfmadd213ps_fma(auVar142,auVar192._0_16_,auVar82);
                        local_450 = auVar82._0_4_;
                        local_440 = vshufps_avx(auVar82,auVar82,0x55);
                        auVar183 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar82,auVar82,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_540._0_8_;
                        uStack_3f8 = local_540._8_8_;
                        local_3f0 = local_530;
                        vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_600 = local_490;
                        local_590.valid = (int *)local_600;
                        local_590.geometryUserPtr = *(void **)(local_5e0._0_8_ + 0x18);
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_4c0 = auVar208._0_32_;
                        local_560._0_4_ = (int)uVar79;
                        local_590.ray = (RTCRayN *)ray;
                        if (*(code **)(local_5e0._0_8_ + 0x40) != (code *)0x0) {
                          auVar183 = ZEXT1664(local_440);
                          auVar188 = ZEXT1664(auVar186);
                          (**(code **)(local_5e0._0_8_ + 0x40))(&local_590);
                          uVar79 = (ulong)(uint)local_560._0_4_;
                          auVar193 = ZEXT3264(local_500);
                          auVar208 = ZEXT3264(local_4c0);
                          auVar192 = ZEXT1664(local_5d0);
                        }
                        bVar78 = (byte)uVar79;
                        uVar79 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar79 & 0xf) == 0) {
LAB_01c8467b:
                          *(int *)(ray + sVar77 * 4 + 0x80) = auVar208._0_4_;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_5e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar183 = ZEXT1664(auVar183._0_16_);
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            (*p_Var14)(&local_590);
                            bVar78 = local_560[0];
                            auVar193 = ZEXT3264(local_500);
                            auVar208 = ZEXT3264(local_4c0);
                            auVar192 = ZEXT1664(local_5d0);
                          }
                          uVar79 = vptestmd_avx512vl(local_600,local_600);
                          uVar79 = uVar79 & 0xf;
                          bVar68 = (byte)uVar79;
                          if (bVar68 == 0) goto LAB_01c8467b;
                          iVar73 = *(int *)(local_590.hit + 4);
                          iVar1 = *(int *)(local_590.hit + 8);
                          iVar2 = *(int *)(local_590.hit + 0xc);
                          bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar68 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xc4);
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xcc)
                          ;
                          iVar73 = *(int *)(local_590.hit + 0x14);
                          iVar1 = *(int *)(local_590.hit + 0x18);
                          iVar2 = *(int *)(local_590.hit + 0x1c);
                          bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar68 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xd4);
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xdc)
                          ;
                          iVar73 = *(int *)(local_590.hit + 0x24);
                          iVar1 = *(int *)(local_590.hit + 0x28);
                          iVar2 = *(int *)(local_590.hit + 0x2c);
                          bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar68 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xe4);
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xec)
                          ;
                          iVar73 = *(int *)(local_590.hit + 0x34);
                          iVar1 = *(int *)(local_590.hit + 0x38);
                          iVar2 = *(int *)(local_590.hit + 0x3c);
                          bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar68 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xf4);
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xfc)
                          ;
                          iVar73 = *(int *)(local_590.hit + 0x44);
                          iVar1 = *(int *)(local_590.hit + 0x48);
                          iVar2 = *(int *)(local_590.hit + 0x4c);
                          bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar68 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar17 * iVar1 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar18 * iVar2 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x10c);
                          auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar82;
                          auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar82;
                          auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar82;
                          auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar82;
                          auVar208 = ZEXT464(*(uint *)(ray + sVar77 * 4 + 0x80));
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & bVar78;
                        uVar140 = auVar208._0_4_;
                        auVar150._4_4_ = uVar140;
                        auVar150._0_4_ = uVar140;
                        auVar150._8_4_ = uVar140;
                        auVar150._12_4_ = uVar140;
                        auVar150._16_4_ = uVar140;
                        auVar150._20_4_ = uVar140;
                        auVar150._24_4_ = uVar140;
                        auVar150._28_4_ = uVar140;
                        uVar156 = vcmpps_avx512vl(auVar193._0_32_,auVar150,2);
                        if ((bVar78 & (byte)uVar156) == 0) goto LAB_01c8470b;
                        bVar78 = bVar78 & (byte)uVar156;
                        uVar79 = (ulong)bVar78;
                        auVar151._8_4_ = 0x7f800000;
                        auVar151._0_8_ = 0x7f8000007f800000;
                        auVar151._12_4_ = 0x7f800000;
                        auVar151._16_4_ = 0x7f800000;
                        auVar151._20_4_ = 0x7f800000;
                        auVar151._24_4_ = 0x7f800000;
                        auVar151._28_4_ = 0x7f800000;
                        auVar94 = vblendmps_avx512vl(auVar151,auVar193._0_32_);
                        auVar129._0_4_ =
                             (uint)(bVar78 & 1) * auVar94._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar78 >> 1 & 1);
                        auVar129._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar78 >> 2 & 1);
                        auVar129._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar78 >> 3 & 1);
                        auVar129._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar78 >> 4 & 1);
                        auVar129._16_4_ = (uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar78 >> 5 & 1);
                        auVar129._20_4_ = (uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar78 >> 6 & 1);
                        auVar129._24_4_ = (uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        auVar129._28_4_ =
                             (uint)(bVar78 >> 7) * auVar94._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar94 = vshufps_avx(auVar129,auVar129,0xb1);
                        auVar94 = vminps_avx(auVar129,auVar94);
                        auVar92 = vshufpd_avx(auVar94,auVar94,5);
                        auVar94 = vminps_avx(auVar94,auVar92);
                        auVar92 = vpermpd_avx2(auVar94,0x4e);
                        auVar94 = vminps_avx(auVar94,auVar92);
                        uVar156 = vcmpps_avx512vl(auVar129,auVar94,0);
                        bVar68 = (byte)uVar156 & bVar78;
                        if (bVar68 != 0) {
                          bVar78 = bVar68;
                        }
                        uVar70 = 0;
                        for (uVar71 = (uint)bVar78; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x80000000) {
                          uVar70 = uVar70 + 1;
                        }
                        uVar69 = (ulong)uVar70;
                      } while( true );
                    }
                    fVar159 = local_200[uVar69];
                    uVar140 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                    fVar154 = 1.0 - fVar159;
                    fVar139 = fVar154 * fVar154 * -3.0;
                    auVar183 = ZEXT464((uint)fVar139);
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                              ZEXT416((uint)(fVar159 * fVar154)),ZEXT416(0xc0000000)
                                             );
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar159 * fVar154)),
                                              ZEXT416((uint)(fVar159 * fVar159)),ZEXT416(0x40000000)
                                             );
                    fVar154 = auVar82._0_4_ * 3.0;
                    fVar155 = auVar85._0_4_ * 3.0;
                    fVar169 = fVar159 * fVar159 * 3.0;
                    auVar185._0_4_ = fVar169 * (float)local_5c0._0_4_;
                    auVar185._4_4_ = fVar169 * (float)local_5c0._4_4_;
                    auVar185._8_4_ = fVar169 * (float)uStack_5b8;
                    auVar185._12_4_ = fVar169 * uStack_5b8._4_4_;
                    auVar188 = ZEXT1664(auVar185);
                    auVar163._4_4_ = fVar155;
                    auVar163._0_4_ = fVar155;
                    auVar163._8_4_ = fVar155;
                    auVar163._12_4_ = fVar155;
                    auVar82 = vfmadd132ps_fma(auVar163,auVar185,local_5b0);
                    auVar172._4_4_ = fVar154;
                    auVar172._0_4_ = fVar154;
                    auVar172._8_4_ = fVar154;
                    auVar172._12_4_ = fVar154;
                    auVar82 = vfmadd132ps_fma(auVar172,auVar82,local_5a0);
                    auVar164._4_4_ = fVar139;
                    auVar164._0_4_ = fVar139;
                    auVar164._8_4_ = fVar139;
                    auVar164._12_4_ = fVar139;
                    auVar82 = vfmadd213ps_fma(auVar164,local_5d0,auVar82);
                    *(undefined4 *)(ray + sVar77 * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + uVar69 * 4);
                    *(int *)(ray + sVar77 * 4 + 0xc0) = auVar82._0_4_;
                    uVar12 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + sVar77 * 4 + 0xd0) = uVar12;
                    uVar12 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + sVar77 * 4 + 0xe0) = uVar12;
                    *(float *)(ray + sVar77 * 4 + 0xf0) = fVar159;
                    *(undefined4 *)(ray + sVar77 * 4 + 0x100) = uVar140;
                    *(undefined4 *)(ray + sVar77 * 4 + 0x110) = uVar3;
                    *(uint *)(ray + sVar77 * 4 + 0x120) = uVar75;
                    *(uint *)(ray + sVar77 * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + sVar77 * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01c8436f;
      }
LAB_01c839e5:
      uVar3 = *(undefined4 *)(ray + sVar77 * 4 + 0x80);
      auVar27._4_4_ = uVar3;
      auVar27._0_4_ = uVar3;
      auVar27._8_4_ = uVar3;
      auVar27._12_4_ = uVar3;
      auVar27._16_4_ = uVar3;
      auVar27._20_4_ = uVar3;
      auVar27._24_4_ = uVar3;
      auVar27._28_4_ = uVar3;
      uVar156 = vcmpps_avx512vl(local_80,auVar27,2);
      uVar75 = (uint)uVar76 & (uint)uVar156;
      uVar76 = (ulong)uVar75;
    } while (uVar75 != 0);
  }
  return;
LAB_01c8470b:
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar210 = ZEXT3264(auVar94);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar211 = ZEXT1664(auVar82);
  auVar212 = ZEXT464(0x35000000);
  auVar94 = vmovdqa64_avx512vl(local_140);
  auVar209 = ZEXT3264(auVar94);
  iVar73 = local_5e4;
LAB_01c8436f:
  lVar74 = lVar74 + 8;
  if (iVar73 <= (int)lVar74) goto LAB_01c839e5;
  goto LAB_01c83a86;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }